

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<8>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  uint uVar57;
  uint uVar58;
  long lVar60;
  byte bVar61;
  uint uVar62;
  ulong uVar63;
  undefined4 uVar64;
  undefined8 unaff_RBP;
  ulong uVar65;
  ulong uVar66;
  float t1;
  float fVar67;
  float fVar68;
  float fVar91;
  float fVar93;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar92;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined8 uVar94;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vfloat4 b0;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  float fVar168;
  float fVar169;
  vfloat4 b0_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar170;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar184;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  float fVar197;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar198;
  undefined1 auVar195 [32];
  vfloat4 a0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  vfloat4 a0_3;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar219 [32];
  float fVar221;
  undefined1 in_ZMM9 [64];
  undefined1 auVar220 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar232 [64];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar241;
  float fVar250;
  float fVar251;
  vfloat4 a0;
  undefined1 auVar243 [16];
  undefined1 auVar242 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar252;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  int local_4fc;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  RTCFilterFunctionNArguments local_398;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 auStack_358 [16];
  undefined1 local_348 [32];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  uint auStack_308 [4];
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2ec;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  uint uStack_1f8;
  float afStack_1f4 [7];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar59;
  undefined1 auVar273 [32];
  
  PVar7 = prim[1];
  uVar65 = (ulong)(byte)PVar7;
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  fVar67 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar69._0_4_ = fVar67 * auVar12._0_4_;
  auVar69._4_4_ = fVar67 * auVar12._4_4_;
  auVar69._8_4_ = fVar67 * auVar12._8_4_;
  auVar69._12_4_ = fVar67 * auVar12._12_4_;
  auVar151._0_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar151._4_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar151._8_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar151._12_4_ = fVar67 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar65 * 4 + 6);
  auVar110 = vpmovsxbd_avx2(auVar12);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar65 * 5 + 6);
  auVar13 = vpmovsxbd_avx2(auVar4);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar65 * 6 + 6);
  auVar14 = vpmovsxbd_avx2(auVar134);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar15 = vpmovsxbd_avx2(auVar5);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar65 * 0xc + 6);
  auVar16 = vpmovsxbd_avx2(auVar6);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar17 = vpmovsxbd_avx2(auVar243);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar18 = vpmovsxbd_avx2(auVar158);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar65 * 0x13 + 6);
  auVar249 = vpmovsxbd_avx2(auVar202);
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar19 = vpmovsxbd_avx2(auVar236);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar263._4_4_ = auVar151._0_4_;
  auVar263._0_4_ = auVar151._0_4_;
  auVar263._8_4_ = auVar151._0_4_;
  auVar263._12_4_ = auVar151._0_4_;
  auVar263._16_4_ = auVar151._0_4_;
  auVar263._20_4_ = auVar151._0_4_;
  auVar263._24_4_ = auVar151._0_4_;
  auVar263._28_4_ = auVar151._0_4_;
  auVar12 = vmovshdup_avx(auVar151);
  uVar94 = auVar12._0_8_;
  auVar271._8_8_ = uVar94;
  auVar271._0_8_ = uVar94;
  auVar271._16_8_ = uVar94;
  auVar271._24_8_ = uVar94;
  auVar12 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar67 = auVar12._0_4_;
  auVar232._0_4_ = fVar67 * auVar14._0_4_;
  fVar91 = auVar12._4_4_;
  auVar232._4_4_ = fVar91 * auVar14._4_4_;
  auVar232._8_4_ = fVar67 * auVar14._8_4_;
  auVar232._12_4_ = fVar91 * auVar14._12_4_;
  auVar232._16_4_ = fVar67 * auVar14._16_4_;
  auVar232._20_4_ = fVar91 * auVar14._20_4_;
  auVar232._28_36_ = in_ZMM10._28_36_;
  auVar232._24_4_ = fVar67 * auVar14._24_4_;
  auVar220._0_4_ = auVar17._0_4_ * fVar67;
  auVar220._4_4_ = auVar17._4_4_ * fVar91;
  auVar220._8_4_ = auVar17._8_4_ * fVar67;
  auVar220._12_4_ = auVar17._12_4_ * fVar91;
  auVar220._16_4_ = auVar17._16_4_ * fVar67;
  auVar220._20_4_ = auVar17._20_4_ * fVar91;
  auVar220._28_36_ = in_ZMM9._28_36_;
  auVar220._24_4_ = auVar17._24_4_ * fVar67;
  auVar192._0_4_ = auVar19._0_4_ * fVar67;
  auVar192._4_4_ = auVar19._4_4_ * fVar91;
  auVar192._8_4_ = auVar19._8_4_ * fVar67;
  auVar192._12_4_ = auVar19._12_4_ * fVar91;
  auVar192._16_4_ = auVar19._16_4_ * fVar67;
  auVar192._20_4_ = auVar19._20_4_ * fVar91;
  auVar192._24_4_ = auVar19._24_4_ * fVar67;
  auVar192._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(auVar232._0_32_,auVar271,auVar13);
  auVar4 = vfmadd231ps_fma(auVar220._0_32_,auVar271,auVar16);
  auVar134 = vfmadd231ps_fma(auVar192,auVar249,auVar271);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar263,auVar110);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar263,auVar15);
  auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar18,auVar263);
  auVar264._4_4_ = auVar69._0_4_;
  auVar264._0_4_ = auVar69._0_4_;
  auVar264._8_4_ = auVar69._0_4_;
  auVar264._12_4_ = auVar69._0_4_;
  auVar264._16_4_ = auVar69._0_4_;
  auVar264._20_4_ = auVar69._0_4_;
  auVar264._24_4_ = auVar69._0_4_;
  auVar264._28_4_ = auVar69._0_4_;
  auVar12 = vmovshdup_avx(auVar69);
  uVar94 = auVar12._0_8_;
  auVar272._8_8_ = uVar94;
  auVar272._0_8_ = uVar94;
  auVar272._16_8_ = uVar94;
  auVar272._24_8_ = uVar94;
  auVar12 = vshufps_avx(auVar69,auVar69,0xaa);
  fVar67 = auVar12._0_4_;
  auVar166._0_4_ = fVar67 * auVar14._0_4_;
  fVar91 = auVar12._4_4_;
  auVar166._4_4_ = fVar91 * auVar14._4_4_;
  auVar166._8_4_ = fVar67 * auVar14._8_4_;
  auVar166._12_4_ = fVar91 * auVar14._12_4_;
  auVar166._16_4_ = fVar67 * auVar14._16_4_;
  auVar166._20_4_ = fVar91 * auVar14._20_4_;
  auVar166._24_4_ = fVar67 * auVar14._24_4_;
  auVar166._28_4_ = 0;
  auVar22._4_4_ = auVar17._4_4_ * fVar91;
  auVar22._0_4_ = auVar17._0_4_ * fVar67;
  auVar22._8_4_ = auVar17._8_4_ * fVar67;
  auVar22._12_4_ = auVar17._12_4_ * fVar91;
  auVar22._16_4_ = auVar17._16_4_ * fVar67;
  auVar22._20_4_ = auVar17._20_4_ * fVar91;
  auVar22._24_4_ = auVar17._24_4_ * fVar67;
  auVar22._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar19._4_4_ * fVar91;
  auVar14._0_4_ = auVar19._0_4_ * fVar67;
  auVar14._8_4_ = auVar19._8_4_ * fVar67;
  auVar14._12_4_ = auVar19._12_4_ * fVar91;
  auVar14._16_4_ = auVar19._16_4_ * fVar67;
  auVar14._20_4_ = auVar19._20_4_ * fVar91;
  auVar14._24_4_ = auVar19._24_4_ * fVar67;
  auVar14._28_4_ = fVar91;
  auVar12 = vfmadd231ps_fma(auVar166,auVar272,auVar13);
  auVar6 = vfmadd231ps_fma(auVar22,auVar272,auVar16);
  auVar243 = vfmadd231ps_fma(auVar14,auVar272,auVar249);
  auVar158 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar264,auVar110);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar264,auVar15);
  auVar125._8_4_ = 0x7fffffff;
  auVar125._0_8_ = 0x7fffffff7fffffff;
  auVar125._12_4_ = 0x7fffffff;
  auVar125._16_4_ = 0x7fffffff;
  auVar125._20_4_ = 0x7fffffff;
  auVar125._24_4_ = 0x7fffffff;
  auVar125._28_4_ = 0x7fffffff;
  auVar243 = vfmadd231ps_fma(ZEXT1632(auVar243),auVar264,auVar18);
  auVar110 = vandps_avx(ZEXT1632(auVar5),auVar125);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar147._16_4_ = 0x219392ef;
  auVar147._20_4_ = 0x219392ef;
  auVar147._24_4_ = 0x219392ef;
  auVar147._28_4_ = 0x219392ef;
  auVar110 = vcmpps_avx(auVar110,auVar147,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar5),auVar147,auVar110);
  auVar110 = vandps_avx(ZEXT1632(auVar4),auVar125);
  auVar110 = vcmpps_avx(auVar110,auVar147,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar4),auVar147,auVar110);
  auVar110 = vandps_avx(ZEXT1632(auVar134),auVar125);
  auVar110 = vcmpps_avx(auVar110,auVar147,1);
  auVar15 = vrcpps_avx(auVar13);
  auVar110 = vblendvps_avx(ZEXT1632(auVar134),auVar147,auVar110);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = 0x3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar217._16_4_ = 0x3f800000;
  auVar217._20_4_ = 0x3f800000;
  auVar217._24_4_ = 0x3f800000;
  auVar217._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar13,auVar15,auVar217);
  auVar13 = vrcpps_avx(auVar14);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar110);
  auVar4 = vfnmadd213ps_fma(auVar14,auVar13,auVar217);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar13,auVar13);
  auVar134 = vfnmadd213ps_fma(auVar110,auVar15,auVar217);
  auVar134 = vfmadd132ps_fma(ZEXT1632(auVar134),auVar15,auVar15);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 7 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar158));
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 9 + 6));
  auVar15._4_4_ = auVar12._4_4_ * auVar110._4_4_;
  auVar15._0_4_ = auVar12._0_4_ * auVar110._0_4_;
  auVar15._8_4_ = auVar12._8_4_ * auVar110._8_4_;
  auVar15._12_4_ = auVar12._12_4_ * auVar110._12_4_;
  auVar15._16_4_ = auVar110._16_4_ * 0.0;
  auVar15._20_4_ = auVar110._20_4_ * 0.0;
  auVar15._24_4_ = auVar110._24_4_ * 0.0;
  auVar15._28_4_ = auVar110._28_4_;
  auVar110 = vcvtdq2ps_avx(auVar13);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar158));
  auVar16._4_4_ = auVar12._4_4_ * auVar110._4_4_;
  auVar16._0_4_ = auVar12._0_4_ * auVar110._0_4_;
  auVar16._8_4_ = auVar12._8_4_ * auVar110._8_4_;
  auVar16._12_4_ = auVar12._12_4_ * auVar110._12_4_;
  auVar16._16_4_ = auVar110._16_4_ * 0.0;
  auVar16._20_4_ = auVar110._20_4_ * 0.0;
  auVar16._24_4_ = auVar110._24_4_ * 0.0;
  auVar16._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0xe + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar6));
  auVar108._1_3_ = 0;
  auVar108[0] = PVar7;
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar17._4_4_ = auVar4._4_4_ * auVar110._4_4_;
  auVar17._0_4_ = auVar4._0_4_ * auVar110._0_4_;
  auVar17._8_4_ = auVar4._8_4_ * auVar110._8_4_;
  auVar17._12_4_ = auVar4._12_4_ * auVar110._12_4_;
  auVar17._16_4_ = auVar110._16_4_ * 0.0;
  auVar17._20_4_ = auVar110._20_4_ * 0.0;
  auVar17._24_4_ = auVar110._24_4_ * 0.0;
  auVar17._28_4_ = auVar110._28_4_;
  auVar110 = vcvtdq2ps_avx(auVar13);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar6));
  auVar18._4_4_ = auVar4._4_4_ * auVar110._4_4_;
  auVar18._0_4_ = auVar4._0_4_ * auVar110._0_4_;
  auVar18._8_4_ = auVar4._8_4_ * auVar110._8_4_;
  auVar18._12_4_ = auVar4._12_4_ * auVar110._12_4_;
  auVar18._16_4_ = auVar110._16_4_ * 0.0;
  auVar18._20_4_ = auVar110._20_4_ * 0.0;
  auVar18._24_4_ = auVar110._24_4_ * 0.0;
  auVar18._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x15 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar243));
  auVar249._4_4_ = auVar110._4_4_ * auVar134._4_4_;
  auVar249._0_4_ = auVar110._0_4_ * auVar134._0_4_;
  auVar249._8_4_ = auVar110._8_4_ * auVar134._8_4_;
  auVar249._12_4_ = auVar110._12_4_ * auVar134._12_4_;
  auVar249._16_4_ = auVar110._16_4_ * 0.0;
  auVar249._20_4_ = auVar110._20_4_ * 0.0;
  auVar249._24_4_ = auVar110._24_4_ * 0.0;
  auVar249._28_4_ = auVar110._28_4_;
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x17 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,ZEXT1632(auVar243));
  auVar19._4_4_ = auVar134._4_4_ * auVar110._4_4_;
  auVar19._0_4_ = auVar134._0_4_ * auVar110._0_4_;
  auVar19._8_4_ = auVar134._8_4_ * auVar110._8_4_;
  auVar19._12_4_ = auVar134._12_4_ * auVar110._12_4_;
  auVar19._16_4_ = auVar110._16_4_ * 0.0;
  auVar19._20_4_ = auVar110._20_4_ * 0.0;
  auVar19._24_4_ = auVar110._24_4_ * 0.0;
  auVar19._28_4_ = auVar110._28_4_;
  auVar110 = vpminsd_avx2(auVar15,auVar16);
  auVar13 = vpminsd_avx2(auVar17,auVar18);
  auVar110 = vmaxps_avx(auVar110,auVar13);
  auVar13 = vpminsd_avx2(auVar249,auVar19);
  uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar218._4_4_ = uVar64;
  auVar218._0_4_ = uVar64;
  auVar218._8_4_ = uVar64;
  auVar218._12_4_ = uVar64;
  auVar218._16_4_ = uVar64;
  auVar218._20_4_ = uVar64;
  auVar218._24_4_ = uVar64;
  auVar218._28_4_ = uVar64;
  auVar13 = vmaxps_avx(auVar13,auVar218);
  auVar110 = vmaxps_avx(auVar110,auVar13);
  local_1d8._4_4_ = auVar110._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar110._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar110._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar110._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar110._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar110._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar110._24_4_ * 0.99999964;
  local_1d8._28_4_ = 0x3f7ffffa;
  auVar110 = vpmaxsd_avx2(auVar15,auVar16);
  auVar13 = vpmaxsd_avx2(auVar17,auVar18);
  auVar110 = vminps_avx(auVar110,auVar13);
  auVar13 = vpmaxsd_avx2(auVar249,auVar19);
  fVar67 = (ray->super_RayK<1>).tfar;
  auVar126._4_4_ = fVar67;
  auVar126._0_4_ = fVar67;
  auVar126._8_4_ = fVar67;
  auVar126._12_4_ = fVar67;
  auVar126._16_4_ = fVar67;
  auVar126._20_4_ = fVar67;
  auVar126._24_4_ = fVar67;
  auVar126._28_4_ = fVar67;
  auVar13 = vminps_avx(auVar13,auVar126);
  auVar110 = vminps_avx(auVar110,auVar13);
  auVar13._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar13._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar13._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar13._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar13._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar13._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar13._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar13._28_4_ = auVar110._28_4_;
  auVar108[4] = PVar7;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar7;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar7;
  auVar108._13_3_ = 0;
  auVar108[0x10] = PVar7;
  auVar108._17_3_ = 0;
  auVar108[0x14] = PVar7;
  auVar108._21_3_ = 0;
  auVar108[0x18] = PVar7;
  auVar108._25_3_ = 0;
  auVar108[0x1c] = PVar7;
  auVar108._29_3_ = 0;
  auVar110 = vcmpps_avx(local_1d8,auVar13,2);
  auVar13 = vpcmpgtd_avx2(auVar108,_DAT_01fb4ba0);
  auVar110 = vandps_avx(auVar110,auVar13);
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  uVar64 = vmovmskps_avx(auVar110);
  uVar65 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar64);
  local_1b8 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
LAB_01356965:
  if (uVar65 == 0) {
    return;
  }
  lVar60 = 0;
  for (uVar63 = uVar65; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar58].ptr;
  local_4c0 = (ulong)*(uint *)(prim + lVar60 * 4 + 6);
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar60 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var11 + uVar63 * (long)pvVar10);
  auVar4 = *(undefined1 (*) [16])(_Var11 + (uVar63 + 1) * (long)pvVar10);
  auVar134 = *(undefined1 (*) [16])(_Var11 + (uVar63 + 2) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar63 + 3));
  fVar67 = *pfVar1;
  fVar91 = pfVar1[1];
  fVar127 = pfVar1[2];
  fVar92 = pfVar1[3];
  lVar60 = *(long *)&pGVar8[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar60 + (long)p_Var9 * uVar63);
  auVar6 = *(undefined1 (*) [16])(lVar60 + (long)p_Var9 * (uVar63 + 1));
  auVar243 = *(undefined1 (*) [16])(lVar60 + (long)p_Var9 * (uVar63 + 2));
  uVar65 = uVar65 - 1 & uVar65;
  pfVar1 = (float *)(lVar60 + (long)p_Var9 * (uVar63 + 3));
  fVar93 = *pfVar1;
  fVar68 = pfVar1[1];
  fVar150 = pfVar1[2];
  fVar221 = pfVar1[3];
  if (uVar65 != 0) {
    uVar66 = uVar65 - 1 & uVar65;
    for (uVar63 = uVar65; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar66 != 0) {
      for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar95._8_4_ = 0x80000000;
  auVar95._0_8_ = 0x8000000080000000;
  auVar95._12_4_ = 0x80000000;
  auVar113._0_4_ = fVar93 * -0.0;
  auVar113._4_4_ = fVar68 * -0.0;
  auVar113._8_4_ = fVar150 * -0.0;
  auVar113._12_4_ = fVar221 * -0.0;
  auVar158 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar243,auVar113);
  auVar70._0_4_ = auVar6._0_4_ + auVar158._0_4_;
  auVar70._4_4_ = auVar6._4_4_ + auVar158._4_4_;
  auVar70._8_4_ = auVar6._8_4_ + auVar158._8_4_;
  auVar70._12_4_ = auVar6._12_4_ + auVar158._12_4_;
  auVar202 = vfmadd231ps_fma(auVar70,auVar5,auVar95);
  auVar151 = ZEXT816(0) << 0x40;
  auVar96._0_4_ = fVar93 * 0.0;
  auVar96._4_4_ = fVar68 * 0.0;
  auVar96._8_4_ = fVar150 * 0.0;
  auVar96._12_4_ = fVar221 * 0.0;
  auVar267._8_4_ = 0x3f000000;
  auVar267._0_8_ = 0x3f0000003f000000;
  auVar267._12_4_ = 0x3f000000;
  auVar158 = vfmadd231ps_fma(auVar96,auVar243,auVar267);
  auVar158 = vfmadd231ps_fma(auVar158,auVar6,auVar151);
  auVar76 = vfnmadd231ps_fma(auVar158,auVar5,auVar267);
  auVar253._0_4_ = fVar67 * -0.0;
  auVar253._4_4_ = fVar91 * -0.0;
  auVar253._8_4_ = fVar127 * -0.0;
  auVar253._12_4_ = fVar92 * -0.0;
  auVar158 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar134,auVar253);
  auVar242._0_4_ = auVar158._0_4_ + auVar4._0_4_;
  auVar242._4_4_ = auVar158._4_4_ + auVar4._4_4_;
  auVar242._8_4_ = auVar158._8_4_ + auVar4._8_4_;
  auVar242._12_4_ = auVar158._12_4_ + auVar4._12_4_;
  auVar158 = vfmadd231ps_fma(auVar242,auVar12,auVar95);
  auVar233._0_4_ = fVar67 * 0.0;
  auVar233._4_4_ = fVar91 * 0.0;
  auVar233._8_4_ = fVar127 * 0.0;
  auVar233._12_4_ = fVar92 * 0.0;
  auVar236 = vfmadd231ps_fma(auVar233,auVar134,auVar267);
  auVar236 = vfmadd231ps_fma(auVar236,auVar4,auVar151);
  auVar131 = vfnmadd231ps_fma(auVar236,auVar12,auVar267);
  auVar114._0_4_ = auVar243._0_4_ + auVar113._0_4_;
  auVar114._4_4_ = auVar243._4_4_ + auVar113._4_4_;
  auVar114._8_4_ = auVar243._8_4_ + auVar113._8_4_;
  auVar114._12_4_ = auVar243._12_4_ + auVar113._12_4_;
  auVar236 = vfmadd231ps_fma(auVar114,auVar6,auVar151);
  auVar236 = vfmadd231ps_fma(auVar236,auVar5,auVar95);
  auVar128._0_4_ = fVar93 * 0.5;
  auVar128._4_4_ = fVar68 * 0.5;
  auVar128._8_4_ = fVar150 * 0.5;
  auVar128._12_4_ = fVar221 * 0.5;
  auVar243 = vfmadd231ps_fma(auVar128,auVar151,auVar243);
  auVar6 = vfnmadd231ps_fma(auVar243,auVar267,auVar6);
  auVar69 = vfmadd231ps_fma(auVar6,auVar151,auVar5);
  auVar199._0_4_ = auVar253._0_4_ + auVar134._0_4_;
  auVar199._4_4_ = auVar253._4_4_ + auVar134._4_4_;
  auVar199._8_4_ = auVar253._8_4_ + auVar134._8_4_;
  auVar199._12_4_ = auVar253._12_4_ + auVar134._12_4_;
  auVar5 = vfmadd231ps_fma(auVar199,auVar4,auVar151);
  auVar6 = vfmadd231ps_fma(auVar5,auVar12,auVar95);
  auVar207._0_4_ = fVar67 * 0.5;
  auVar207._4_4_ = fVar91 * 0.5;
  auVar207._8_4_ = fVar127 * 0.5;
  auVar207._12_4_ = fVar92 * 0.5;
  auVar134 = vfmadd231ps_fma(auVar207,auVar151,auVar134);
  auVar4 = vfnmadd231ps_fma(auVar134,auVar267,auVar4);
  auVar151 = vfmadd231ps_fma(auVar4,auVar151,auVar12);
  auVar12 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar4 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar93 = auVar76._0_4_;
  auVar152._0_4_ = fVar93 * auVar4._0_4_;
  fVar68 = auVar76._4_4_;
  auVar152._4_4_ = fVar68 * auVar4._4_4_;
  fVar150 = auVar76._8_4_;
  auVar152._8_4_ = fVar150 * auVar4._8_4_;
  fVar221 = auVar76._12_4_;
  auVar152._12_4_ = fVar221 * auVar4._12_4_;
  auVar4 = vfmsub231ps_fma(auVar152,auVar12,auVar158);
  auVar134 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar4 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar153._0_4_ = fVar93 * auVar4._0_4_;
  auVar153._4_4_ = fVar68 * auVar4._4_4_;
  auVar153._8_4_ = fVar150 * auVar4._8_4_;
  auVar153._12_4_ = fVar221 * auVar4._12_4_;
  auVar12 = vfmsub231ps_fma(auVar153,auVar12,auVar131);
  auVar5 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar4 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar12 = vshufps_avx(auVar6,auVar6,0xc9);
  fVar184 = auVar69._0_4_;
  auVar140._0_4_ = fVar184 * auVar12._0_4_;
  fVar196 = auVar69._4_4_;
  auVar140._4_4_ = fVar196 * auVar12._4_4_;
  fVar197 = auVar69._8_4_;
  auVar140._8_4_ = fVar197 * auVar12._8_4_;
  fVar198 = auVar69._12_4_;
  auVar140._12_4_ = fVar198 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar140,auVar4,auVar6);
  auVar6 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar243 = vshufps_avx(auVar151,auVar151,0xc9);
  auVar12 = vdpps_avx(auVar134,auVar134,0x7f);
  auVar171._0_4_ = fVar184 * auVar243._0_4_;
  auVar171._4_4_ = fVar196 * auVar243._4_4_;
  auVar171._8_4_ = fVar197 * auVar243._8_4_;
  auVar171._12_4_ = fVar198 * auVar243._12_4_;
  auVar4 = vfmsub231ps_fma(auVar171,auVar4,auVar151);
  auVar243 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar91 = auVar12._0_4_;
  auVar208._4_12_ = ZEXT812(0) << 0x20;
  auVar208._0_4_ = fVar91;
  auVar4 = vrsqrtss_avx(auVar208,auVar208);
  fVar67 = auVar4._0_4_;
  fVar67 = fVar67 * 1.5 + fVar91 * -0.5 * fVar67 * fVar67 * fVar67;
  auVar4 = vdpps_avx(auVar134,auVar5,0x7f);
  fVar149 = fVar67 * auVar134._0_4_;
  fVar168 = fVar67 * auVar134._4_4_;
  fVar169 = fVar67 * auVar134._8_4_;
  fVar170 = fVar67 * auVar134._12_4_;
  auVar222._0_4_ = auVar5._0_4_ * fVar91;
  auVar222._4_4_ = auVar5._4_4_ * fVar91;
  auVar222._8_4_ = auVar5._8_4_ * fVar91;
  auVar222._12_4_ = auVar5._12_4_ * fVar91;
  fVar91 = auVar4._0_4_;
  auVar185._0_4_ = fVar91 * auVar134._0_4_;
  auVar185._4_4_ = fVar91 * auVar134._4_4_;
  auVar185._8_4_ = fVar91 * auVar134._8_4_;
  auVar185._12_4_ = fVar91 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar222,auVar185);
  auVar4 = vrcpss_avx(auVar208,auVar208);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar4,SUB6416(ZEXT464(0x40000000),0));
  fVar127 = auVar4._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar92 = auVar12._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar92;
  auVar4 = vrsqrtss_avx(auVar209,auVar209);
  fVar91 = auVar4._0_4_;
  fVar91 = fVar91 * 1.5 + fVar92 * -0.5 * fVar91 * fVar91 * fVar91;
  auVar4 = vdpps_avx(auVar6,auVar243,0x7f);
  fVar241 = fVar91 * auVar6._0_4_;
  fVar250 = fVar91 * auVar6._4_4_;
  fVar251 = fVar91 * auVar6._8_4_;
  fVar252 = fVar91 * auVar6._12_4_;
  auVar172._0_4_ = fVar92 * auVar243._0_4_;
  auVar172._4_4_ = fVar92 * auVar243._4_4_;
  auVar172._8_4_ = fVar92 * auVar243._8_4_;
  auVar172._12_4_ = fVar92 * auVar243._12_4_;
  fVar92 = auVar4._0_4_;
  auVar141._0_4_ = fVar92 * auVar6._0_4_;
  auVar141._4_4_ = fVar92 * auVar6._4_4_;
  auVar141._8_4_ = fVar92 * auVar6._8_4_;
  auVar141._12_4_ = fVar92 * auVar6._12_4_;
  auVar5 = vsubps_avx(auVar172,auVar141);
  auVar4 = vrcpss_avx(auVar209,auVar209);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar4,SUB6416(ZEXT464(0x40000000),0));
  fVar92 = auVar12._0_4_ * auVar4._0_4_;
  auVar12 = vshufps_avx(auVar202,auVar202,0xff);
  auVar200._0_4_ = auVar12._0_4_ * fVar149;
  auVar200._4_4_ = auVar12._4_4_ * fVar168;
  auVar200._8_4_ = auVar12._8_4_ * fVar169;
  auVar200._12_4_ = auVar12._12_4_ * fVar170;
  local_448 = vsubps_avx(auVar202,auVar200);
  auVar4 = vshufps_avx(auVar76,auVar76,0xff);
  auVar154._0_4_ = auVar4._0_4_ * fVar149 + auVar12._0_4_ * fVar67 * fVar127 * auVar134._0_4_;
  auVar154._4_4_ = auVar4._4_4_ * fVar168 + auVar12._4_4_ * fVar67 * fVar127 * auVar134._4_4_;
  auVar154._8_4_ = auVar4._8_4_ * fVar169 + auVar12._8_4_ * fVar67 * fVar127 * auVar134._8_4_;
  auVar154._12_4_ = auVar4._12_4_ * fVar170 + auVar12._12_4_ * fVar67 * fVar127 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar76,auVar154);
  local_458._0_4_ = auVar200._0_4_ + auVar202._0_4_;
  local_458._4_4_ = auVar200._4_4_ + auVar202._4_4_;
  fStack_450 = auVar200._8_4_ + auVar202._8_4_;
  fStack_44c = auVar200._12_4_ + auVar202._12_4_;
  auVar12 = vshufps_avx(auVar236,auVar236,0xff);
  auVar97._0_4_ = fVar241 * auVar12._0_4_;
  auVar97._4_4_ = fVar250 * auVar12._4_4_;
  auVar97._8_4_ = fVar251 * auVar12._8_4_;
  auVar97._12_4_ = fVar252 * auVar12._12_4_;
  local_468 = vsubps_avx(auVar236,auVar97);
  auVar4 = vshufps_avx(auVar69,auVar69,0xff);
  auVar71._0_4_ = fVar241 * auVar4._0_4_ + auVar12._0_4_ * fVar91 * auVar5._0_4_ * fVar92;
  auVar71._4_4_ = fVar250 * auVar4._4_4_ + auVar12._4_4_ * fVar91 * auVar5._4_4_ * fVar92;
  auVar71._8_4_ = fVar251 * auVar4._8_4_ + auVar12._8_4_ * fVar91 * auVar5._8_4_ * fVar92;
  auVar71._12_4_ = fVar252 * auVar4._12_4_ + auVar12._12_4_ * fVar91 * auVar5._12_4_ * fVar92;
  auVar12 = vsubps_avx(auVar69,auVar71);
  local_4b8 = auVar236._0_4_ + auVar97._0_4_;
  fStack_4b4 = auVar236._4_4_ + auVar97._4_4_;
  fStack_4b0 = auVar236._8_4_ + auVar97._8_4_;
  fStack_4ac = auVar236._12_4_ + auVar97._12_4_;
  local_478._0_4_ = local_448._0_4_ + auVar134._0_4_ * 0.33333334;
  local_478._4_4_ = local_448._4_4_ + auVar134._4_4_ * 0.33333334;
  local_478._8_4_ = local_448._8_4_ + auVar134._8_4_ * 0.33333334;
  local_478._12_4_ = local_448._12_4_ + auVar134._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar12._12_4_ * 0.33333334;
  local_488 = vsubps_avx(local_468,auVar72);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar134 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar134,auVar134,0x55);
  auVar4 = vshufps_avx(auVar134,auVar134,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar67 = (pre->ray_space).vz.field_0.m128[0];
  fVar91 = (pre->ray_space).vz.field_0.m128[1];
  fVar127 = (pre->ray_space).vz.field_0.m128[2];
  fVar92 = (pre->ray_space).vz.field_0.m128[3];
  auVar155._0_4_ = fVar67 * auVar4._0_4_;
  auVar155._4_4_ = fVar91 * auVar4._4_4_;
  auVar155._8_4_ = fVar127 * auVar4._8_4_;
  auVar155._12_4_ = fVar92 * auVar4._12_4_;
  auVar69 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar3,auVar12);
  auVar5 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar5,auVar5,0x55);
  auVar4 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar73._0_4_ = fVar67 * auVar4._0_4_;
  auVar73._4_4_ = fVar91 * auVar4._4_4_;
  auVar73._8_4_ = fVar127 * auVar4._8_4_;
  auVar73._12_4_ = fVar92 * auVar4._12_4_;
  auVar151 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar12);
  auVar4 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar4,auVar4,0xaa);
  auVar115._0_4_ = fVar67 * auVar12._0_4_;
  auVar115._4_4_ = fVar91 * auVar12._4_4_;
  auVar115._8_4_ = fVar127 * auVar12._8_4_;
  auVar115._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar4,auVar4,0x55);
  auVar76 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar3,auVar12);
  auVar6 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar6,auVar6,0xaa);
  auVar129._0_4_ = fVar67 * auVar12._0_4_;
  auVar129._4_4_ = fVar91 * auVar12._4_4_;
  auVar129._8_4_ = fVar127 * auVar12._8_4_;
  auVar129._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar6,auVar6,0x55);
  auVar131 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar3,auVar12);
  auVar243 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar243,auVar243,0xaa);
  auVar98._0_4_ = fVar67 * auVar12._0_4_;
  auVar98._4_4_ = fVar91 * auVar12._4_4_;
  auVar98._8_4_ = fVar127 * auVar12._8_4_;
  auVar98._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar243,auVar243,0x55);
  auVar70 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar12);
  local_498._0_4_ = (fVar93 + auVar154._0_4_) * 0.33333334 + (float)local_458._0_4_;
  local_498._4_4_ = (fVar68 + auVar154._4_4_) * 0.33333334 + (float)local_458._4_4_;
  fStack_490 = (fVar150 + auVar154._8_4_) * 0.33333334 + fStack_450;
  fStack_48c = (fVar221 + auVar154._12_4_) * 0.33333334 + fStack_44c;
  auVar158 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar158,auVar158,0xaa);
  auVar223._0_4_ = fVar67 * auVar12._0_4_;
  auVar223._4_4_ = fVar91 * auVar12._4_4_;
  auVar223._8_4_ = fVar127 * auVar12._8_4_;
  auVar223._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar158,auVar158,0x55);
  auVar72 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar3,auVar12);
  auVar234._0_4_ = (fVar184 + auVar71._0_4_) * 0.33333334;
  auVar234._4_4_ = (fVar196 + auVar71._4_4_) * 0.33333334;
  auVar234._8_4_ = (fVar197 + auVar71._8_4_) * 0.33333334;
  auVar234._12_4_ = (fVar198 + auVar71._12_4_) * 0.33333334;
  auVar21._4_4_ = fStack_4b4;
  auVar21._0_4_ = local_4b8;
  auVar21._8_4_ = fStack_4b0;
  auVar21._12_4_ = fStack_4ac;
  _local_4a8 = vsubps_avx(auVar21,auVar234);
  auVar202 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar202,auVar202,0xaa);
  auVar235._0_4_ = fVar67 * auVar12._0_4_;
  auVar235._4_4_ = fVar91 * auVar12._4_4_;
  auVar235._8_4_ = fVar127 * auVar12._8_4_;
  auVar235._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar202,auVar202,0x55);
  auVar71 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar3,auVar12);
  auVar236 = vsubps_avx(auVar21,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar236,auVar236,0xaa);
  auVar186._0_4_ = fVar67 * auVar12._0_4_;
  auVar186._4_4_ = fVar91 * auVar12._4_4_;
  auVar186._8_4_ = fVar127 * auVar12._8_4_;
  auVar186._12_4_ = fVar92 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar236,auVar236,0x55);
  auVar12 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar12);
  local_538._0_4_ = auVar134._0_4_;
  auVar173._4_4_ = local_538._0_4_;
  auVar173._0_4_ = local_538._0_4_;
  auVar173._8_4_ = local_538._0_4_;
  auVar173._12_4_ = local_538._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar69 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar3,auVar173);
  local_4d8._0_4_ = auVar5._0_4_;
  auVar174._4_4_ = local_4d8._0_4_;
  auVar174._0_4_ = local_4d8._0_4_;
  auVar174._8_4_ = local_4d8._0_4_;
  auVar174._12_4_ = local_4d8._0_4_;
  auVar5 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar3,auVar174);
  uVar64 = auVar4._0_4_;
  auVar175._4_4_ = uVar64;
  auVar175._0_4_ = uVar64;
  auVar175._8_4_ = uVar64;
  auVar175._12_4_ = uVar64;
  auVar151 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar175);
  uVar64 = auVar6._0_4_;
  auVar176._4_4_ = uVar64;
  auVar176._0_4_ = uVar64;
  auVar176._8_4_ = uVar64;
  auVar176._12_4_ = uVar64;
  auVar6 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar3,auVar176);
  uVar64 = auVar243._0_4_;
  auVar177._4_4_ = uVar64;
  auVar177._0_4_ = uVar64;
  auVar177._8_4_ = uVar64;
  auVar177._12_4_ = uVar64;
  auVar243 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar3,auVar177);
  uVar64 = auVar158._0_4_;
  auVar178._4_4_ = uVar64;
  auVar178._0_4_ = uVar64;
  auVar178._8_4_ = uVar64;
  auVar178._12_4_ = uVar64;
  auVar158 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar178);
  uVar64 = auVar202._0_4_;
  auVar74._4_4_ = uVar64;
  auVar74._0_4_ = uVar64;
  auVar74._8_4_ = uVar64;
  auVar74._12_4_ = uVar64;
  auVar202 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar74);
  uVar64 = auVar236._0_4_;
  auVar75._4_4_ = uVar64;
  auVar75._0_4_ = uVar64;
  auVar75._8_4_ = uVar64;
  auVar75._12_4_ = uVar64;
  auVar236 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar75);
  local_4d8 = vmovlhps_avx(auVar69,auVar243);
  local_4e8 = vmovlhps_avx(auVar5,auVar158);
  local_4f8 = vmovlhps_avx(auVar151,auVar202);
  _local_238 = vmovlhps_avx(auVar6,auVar236);
  auVar12 = vminps_avx(local_4d8,local_4e8);
  auVar4 = vminps_avx(local_4f8,_local_238);
  auVar134 = vminps_avx(auVar12,auVar4);
  auVar12 = vmaxps_avx(local_4d8,local_4e8);
  auVar4 = vmaxps_avx(local_4f8,_local_238);
  auVar12 = vmaxps_avx(auVar12,auVar4);
  auVar4 = vshufpd_avx(auVar134,auVar134,3);
  auVar134 = vminps_avx(auVar134,auVar4);
  auVar4 = vshufpd_avx(auVar12,auVar12,3);
  local_248._8_4_ = 0x7fffffff;
  local_248._0_8_ = 0x7fffffff7fffffff;
  local_248._12_4_ = 0x7fffffff;
  auVar4 = vmaxps_avx(auVar12,auVar4);
  auVar12 = vandps_avx(local_248,auVar134);
  auVar4 = vandps_avx(local_248,auVar4);
  auVar12 = vmaxps_avx(auVar12,auVar4);
  auVar4 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar4,auVar12);
  local_78 = auVar12._0_4_ * 9.536743e-07;
  local_3c8._0_8_ = auVar69._0_8_;
  local_3c8._8_8_ = local_3c8._0_8_;
  local_3d8._8_8_ = auVar5._0_8_;
  local_3d8._0_8_ = auVar5._0_8_;
  local_3e8._8_8_ = auVar151._0_8_;
  local_3e8._0_8_ = auVar151._0_8_;
  local_3f8._8_8_ = auVar6._0_8_;
  local_3f8._0_8_ = auVar6._0_8_;
  local_408 = auVar243._0_8_;
  register0x00001308 = local_408;
  register0x00001388 = auVar158._0_8_;
  local_418 = auVar158._0_8_;
  register0x00001488 = auVar202._0_8_;
  local_428 = auVar202._0_8_;
  register0x000014c8 = auVar236._0_8_;
  local_438 = auVar236._0_8_;
  local_258 = ZEXT416((uint)local_78);
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar63 = 0;
  local_208 = vsubps_avx(local_4e8,local_4d8);
  local_218 = vsubps_avx(local_4f8,local_4e8);
  local_228 = vsubps_avx(_local_238,local_4f8);
  local_278 = vsubps_avx(_local_458,local_448);
  local_288 = vsubps_avx(_local_498,local_478);
  local_298 = vsubps_avx(_local_4a8,local_488);
  auVar131._4_4_ = fStack_4b4;
  auVar131._0_4_ = local_4b8;
  auVar131._8_4_ = fStack_4b0;
  auVar131._12_4_ = fStack_4ac;
  _local_2a8 = vsubps_avx(auVar131,local_468);
  auVar76 = ZEXT816(0x3f80000000000000);
  local_268 = auVar76;
LAB_013570a3:
  auVar12 = vshufps_avx(auVar76,auVar76,0x50);
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = 0x3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar273._16_4_ = 0x3f800000;
  auVar273._0_16_ = auVar268;
  auVar273._20_4_ = 0x3f800000;
  auVar273._24_4_ = 0x3f800000;
  auVar273._28_4_ = 0x3f800000;
  auVar4 = vsubps_avx(auVar268,auVar12);
  fVar67 = auVar12._0_4_;
  auVar77._0_4_ = local_408._0_4_ * fVar67;
  fVar91 = auVar12._4_4_;
  auVar77._4_4_ = local_408._4_4_ * fVar91;
  fVar127 = auVar12._8_4_;
  auVar77._8_4_ = local_408._8_4_ * fVar127;
  fVar92 = auVar12._12_4_;
  auVar77._12_4_ = local_408._12_4_ * fVar92;
  auVar179._0_4_ = local_418._0_4_ * fVar67;
  auVar179._4_4_ = local_418._4_4_ * fVar91;
  auVar179._8_4_ = local_418._8_4_ * fVar127;
  auVar179._12_4_ = local_418._12_4_ * fVar92;
  auVar142._0_4_ = local_428._0_4_ * fVar67;
  auVar142._4_4_ = local_428._4_4_ * fVar91;
  auVar142._8_4_ = local_428._8_4_ * fVar127;
  auVar142._12_4_ = local_428._12_4_ * fVar92;
  auVar116._0_4_ = local_438._0_4_ * fVar67;
  auVar116._4_4_ = local_438._4_4_ * fVar91;
  auVar116._8_4_ = local_438._8_4_ * fVar127;
  auVar116._12_4_ = local_438._12_4_ * fVar92;
  auVar6 = vfmadd231ps_fma(auVar77,auVar4,local_3c8);
  auVar243 = vfmadd231ps_fma(auVar179,auVar4,local_3d8);
  auVar158 = vfmadd231ps_fma(auVar142,auVar4,local_3e8);
  auVar202 = vfmadd231ps_fma(auVar116,local_3f8,auVar4);
  auVar12 = vmovshdup_avx(local_268);
  fVar67 = local_268._0_4_;
  fStack_140 = (auVar12._0_4_ - fVar67) * 0.04761905;
  auVar219._4_4_ = fVar67;
  auVar219._0_4_ = fVar67;
  auVar219._8_4_ = fVar67;
  auVar219._12_4_ = fVar67;
  auVar219._16_4_ = fVar67;
  auVar219._20_4_ = fVar67;
  auVar219._24_4_ = fVar67;
  auVar219._28_4_ = fVar67;
  auVar110._0_8_ = auVar12._0_8_;
  auVar110._8_8_ = auVar110._0_8_;
  auVar110._16_8_ = auVar110._0_8_;
  auVar110._24_8_ = auVar110._0_8_;
  auVar110 = vsubps_avx(auVar110,auVar219);
  uVar64 = auVar6._0_4_;
  auVar265._4_4_ = uVar64;
  auVar265._0_4_ = uVar64;
  auVar265._8_4_ = uVar64;
  auVar265._12_4_ = uVar64;
  auVar265._16_4_ = uVar64;
  auVar265._20_4_ = uVar64;
  auVar265._24_4_ = uVar64;
  auVar265._28_4_ = uVar64;
  auVar12 = vmovshdup_avx(auVar6);
  uVar94 = auVar12._0_8_;
  auVar259._8_8_ = uVar94;
  auVar259._0_8_ = uVar94;
  auVar259._16_8_ = uVar94;
  auVar259._24_8_ = uVar94;
  fVar184 = auVar243._0_4_;
  auVar247._4_4_ = fVar184;
  auVar247._0_4_ = fVar184;
  auVar247._8_4_ = fVar184;
  auVar247._12_4_ = fVar184;
  auVar247._16_4_ = fVar184;
  auVar247._20_4_ = fVar184;
  auVar247._24_4_ = fVar184;
  auVar247._28_4_ = fVar184;
  auVar4 = vmovshdup_avx(auVar243);
  auVar111._0_8_ = auVar4._0_8_;
  auVar111._8_8_ = auVar111._0_8_;
  auVar111._16_8_ = auVar111._0_8_;
  auVar111._24_8_ = auVar111._0_8_;
  fVar221 = auVar158._0_4_;
  auVar193._4_4_ = fVar221;
  auVar193._0_4_ = fVar221;
  auVar193._8_4_ = fVar221;
  auVar193._12_4_ = fVar221;
  auVar193._16_4_ = fVar221;
  auVar193._20_4_ = fVar221;
  auVar193._24_4_ = fVar221;
  auVar193._28_4_ = fVar221;
  auVar134 = vmovshdup_avx(auVar158);
  auVar205._0_8_ = auVar134._0_8_;
  auVar205._8_8_ = auVar205._0_8_;
  auVar205._16_8_ = auVar205._0_8_;
  auVar205._24_8_ = auVar205._0_8_;
  fVar150 = auVar202._0_4_;
  auVar5 = vmovshdup_avx(auVar202);
  auVar236 = vfmadd132ps_fma(auVar110,auVar219,_DAT_01f7b040);
  auVar110 = vsubps_avx(auVar273,ZEXT1632(auVar236));
  fVar67 = auVar236._0_4_;
  fVar91 = auVar236._4_4_;
  auVar23._4_4_ = fVar184 * fVar91;
  auVar23._0_4_ = fVar184 * fVar67;
  fVar127 = auVar236._8_4_;
  auVar23._8_4_ = fVar184 * fVar127;
  fVar92 = auVar236._12_4_;
  auVar23._12_4_ = fVar184 * fVar92;
  auVar23._16_4_ = fVar184 * 0.0;
  auVar23._20_4_ = fVar184 * 0.0;
  auVar23._24_4_ = fVar184 * 0.0;
  auVar23._28_4_ = 0x3f800000;
  auVar236 = vfmadd231ps_fma(auVar23,auVar110,auVar265);
  fVar93 = auVar4._0_4_;
  fVar68 = auVar4._4_4_;
  auVar24._4_4_ = fVar68 * fVar91;
  auVar24._0_4_ = fVar93 * fVar67;
  auVar24._8_4_ = fVar93 * fVar127;
  auVar24._12_4_ = fVar68 * fVar92;
  auVar24._16_4_ = fVar93 * 0.0;
  auVar24._20_4_ = fVar68 * 0.0;
  auVar24._24_4_ = fVar93 * 0.0;
  auVar24._28_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar24,auVar110,auVar259);
  auVar25._4_4_ = fVar221 * fVar91;
  auVar25._0_4_ = fVar221 * fVar67;
  auVar25._8_4_ = fVar221 * fVar127;
  auVar25._12_4_ = fVar221 * fVar92;
  auVar25._16_4_ = fVar221 * 0.0;
  auVar25._20_4_ = fVar221 * 0.0;
  auVar25._24_4_ = fVar221 * 0.0;
  auVar25._28_4_ = auVar12._4_4_;
  auVar151 = vfmadd231ps_fma(auVar25,auVar110,auVar247);
  fVar93 = auVar134._0_4_;
  fVar68 = auVar134._4_4_;
  auVar26._4_4_ = fVar68 * fVar91;
  auVar26._0_4_ = fVar93 * fVar67;
  auVar26._8_4_ = fVar93 * fVar127;
  auVar26._12_4_ = fVar68 * fVar92;
  auVar26._16_4_ = fVar93 * 0.0;
  auVar26._20_4_ = fVar68 * 0.0;
  auVar26._24_4_ = fVar93 * 0.0;
  auVar26._28_4_ = fVar184;
  auVar131 = vfmadd231ps_fma(auVar26,auVar110,auVar111);
  auVar12 = vshufps_avx(auVar6,auVar6,0xaa);
  local_3b8._8_8_ = auVar12._0_8_;
  local_3b8._0_8_ = local_3b8._8_8_;
  local_3b8._16_8_ = local_3b8._8_8_;
  local_3b8._24_8_ = local_3b8._8_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  uStack_530 = auVar4._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  auVar27._4_4_ = fVar150 * fVar91;
  auVar27._0_4_ = fVar150 * fVar67;
  auVar27._8_4_ = fVar150 * fVar127;
  auVar27._12_4_ = fVar150 * fVar92;
  auVar27._16_4_ = fVar150 * 0.0;
  auVar27._20_4_ = fVar150 * 0.0;
  auVar27._24_4_ = fVar150 * 0.0;
  auVar27._28_4_ = fVar150;
  auVar6 = vfmadd231ps_fma(auVar27,auVar110,auVar193);
  auVar4 = vshufps_avx(auVar243,auVar243,0xaa);
  auVar194._0_8_ = auVar4._0_8_;
  auVar194._8_8_ = auVar194._0_8_;
  auVar194._16_8_ = auVar194._0_8_;
  auVar194._24_8_ = auVar194._0_8_;
  auVar134 = vshufps_avx(auVar243,auVar243,0xff);
  local_348._8_8_ = auVar134._0_8_;
  local_348._0_8_ = local_348._8_8_;
  local_348._16_8_ = local_348._8_8_;
  local_348._24_8_ = local_348._8_8_;
  fVar93 = auVar5._0_4_;
  fVar68 = auVar5._4_4_;
  auVar28._4_4_ = fVar68 * fVar91;
  auVar28._0_4_ = fVar93 * fVar67;
  auVar28._8_4_ = fVar93 * fVar127;
  auVar28._12_4_ = fVar68 * fVar92;
  auVar28._16_4_ = fVar93 * 0.0;
  auVar28._20_4_ = fVar68 * 0.0;
  auVar28._24_4_ = fVar93 * 0.0;
  auVar28._28_4_ = auVar12._4_4_;
  auVar70 = vfmadd231ps_fma(auVar28,auVar110,auVar205);
  auVar29._28_4_ = fVar68;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar151._12_4_ * fVar92,
                          CONCAT48(auVar151._8_4_ * fVar127,
                                   CONCAT44(auVar151._4_4_ * fVar91,auVar151._0_4_ * fVar67))));
  auVar236 = vfmadd231ps_fma(auVar29,auVar110,ZEXT1632(auVar236));
  fVar93 = auVar134._4_4_;
  auVar30._28_4_ = fVar93;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar131._12_4_ * fVar92,
                          CONCAT48(auVar131._8_4_ * fVar127,
                                   CONCAT44(auVar131._4_4_ * fVar91,auVar131._0_4_ * fVar67))));
  auVar69 = vfmadd231ps_fma(auVar30,auVar110,ZEXT1632(auVar69));
  auVar12 = vshufps_avx(auVar158,auVar158,0xaa);
  uVar94 = auVar12._0_8_;
  auVar183._8_8_ = uVar94;
  auVar183._0_8_ = uVar94;
  auVar183._16_8_ = uVar94;
  auVar183._24_8_ = uVar94;
  auVar5 = vshufps_avx(auVar158,auVar158,0xff);
  uVar94 = auVar5._0_8_;
  auVar274._8_8_ = uVar94;
  auVar274._0_8_ = uVar94;
  auVar274._16_8_ = uVar94;
  auVar274._24_8_ = uVar94;
  auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar92,
                                                CONCAT48(auVar6._8_4_ * fVar127,
                                                         CONCAT44(auVar6._4_4_ * fVar91,
                                                                  auVar6._0_4_ * fVar67)))),auVar110
                             ,ZEXT1632(auVar151));
  auVar6 = vshufps_avx(auVar202,auVar202,0xaa);
  auVar243 = vshufps_avx(auVar202,auVar202,0xff);
  auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar70._12_4_,
                                                CONCAT48(fVar127 * auVar70._8_4_,
                                                         CONCAT44(fVar91 * auVar70._4_4_,
                                                                  fVar67 * auVar70._0_4_)))),
                             auVar110,ZEXT1632(auVar131));
  auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar158._12_4_,
                                                CONCAT48(fVar127 * auVar158._8_4_,
                                                         CONCAT44(fVar91 * auVar158._4_4_,
                                                                  fVar67 * auVar158._0_4_)))),
                             auVar110,ZEXT1632(auVar236));
  auVar13 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar236));
  auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar202._12_4_,
                                                CONCAT48(fVar127 * auVar202._8_4_,
                                                         CONCAT44(fVar91 * auVar202._4_4_,
                                                                  fVar67 * auVar202._0_4_)))),
                             auVar110,ZEXT1632(auVar69));
  auVar14 = vsubps_avx(ZEXT1632(auVar202),ZEXT1632(auVar69));
  fStack_30c = auVar14._28_4_;
  auVar248._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar248._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar248._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar248._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar248._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar248._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar248._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar248._28_4_ = 0;
  local_328._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_328._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_320 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_31c = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_318 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_314 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_310 = fStack_140 * auVar14._24_4_ * 3.0;
  fVar68 = auVar4._0_4_;
  fVar150 = auVar4._4_4_;
  auVar31._4_4_ = fVar150 * fVar91;
  auVar31._0_4_ = fVar68 * fVar67;
  auVar31._8_4_ = fVar68 * fVar127;
  auVar31._12_4_ = fVar150 * fVar92;
  auVar31._16_4_ = fVar68 * 0.0;
  auVar31._20_4_ = fVar150 * 0.0;
  auVar31._24_4_ = fVar68 * 0.0;
  auVar31._28_4_ = fStack_30c;
  auVar4 = vfmadd231ps_fma(auVar31,auVar110,local_3b8);
  fVar68 = auVar134._0_4_;
  auVar32._4_4_ = fVar93 * fVar91;
  auVar32._0_4_ = fVar68 * fVar67;
  auVar32._8_4_ = fVar68 * fVar127;
  auVar32._12_4_ = fVar93 * fVar92;
  auVar32._16_4_ = fVar68 * 0.0;
  auVar32._20_4_ = fVar93 * 0.0;
  auVar32._24_4_ = fVar68 * 0.0;
  auVar32._28_4_ = 0;
  auVar134 = vfmadd231ps_fma(auVar32,auVar110,_local_538);
  fVar93 = auVar12._0_4_;
  fVar68 = auVar12._4_4_;
  auVar33._4_4_ = fVar68 * fVar91;
  auVar33._0_4_ = fVar93 * fVar67;
  auVar33._8_4_ = fVar93 * fVar127;
  auVar33._12_4_ = fVar68 * fVar92;
  auVar33._16_4_ = fVar93 * 0.0;
  auVar33._20_4_ = fVar68 * 0.0;
  auVar33._24_4_ = fVar93 * 0.0;
  auVar33._28_4_ = auVar13._28_4_;
  auVar12 = vfmadd231ps_fma(auVar33,auVar110,auVar194);
  fVar93 = auVar5._0_4_;
  fVar221 = auVar5._4_4_;
  auVar34._4_4_ = fVar221 * fVar91;
  auVar34._0_4_ = fVar93 * fVar67;
  auVar34._8_4_ = fVar93 * fVar127;
  auVar34._12_4_ = fVar221 * fVar92;
  auVar34._16_4_ = fVar93 * 0.0;
  auVar34._20_4_ = fVar221 * 0.0;
  auVar34._24_4_ = fVar93 * 0.0;
  auVar34._28_4_ = fVar150;
  auVar5 = vfmadd231ps_fma(auVar34,auVar110,local_348);
  local_348 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar151));
  fVar93 = auVar6._0_4_;
  fVar68 = auVar6._4_4_;
  auVar35._4_4_ = fVar68 * fVar91;
  auVar35._0_4_ = fVar93 * fVar67;
  auVar35._8_4_ = fVar93 * fVar127;
  auVar35._12_4_ = fVar68 * fVar92;
  auVar35._16_4_ = fVar93 * 0.0;
  auVar35._20_4_ = fVar68 * 0.0;
  auVar35._24_4_ = fVar93 * 0.0;
  auVar35._28_4_ = fVar68;
  auVar6 = vfmadd231ps_fma(auVar35,auVar110,auVar183);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar158));
  fVar93 = auVar243._0_4_;
  fVar68 = auVar243._4_4_;
  auVar36._4_4_ = fVar68 * fVar91;
  auVar36._0_4_ = fVar93 * fVar67;
  auVar36._8_4_ = fVar93 * fVar127;
  auVar36._12_4_ = fVar68 * fVar92;
  auVar36._16_4_ = fVar93 * 0.0;
  auVar36._20_4_ = fVar68 * 0.0;
  auVar36._24_4_ = fVar93 * 0.0;
  auVar36._28_4_ = fVar68;
  auVar243 = vfmadd231ps_fma(auVar36,auVar110,auVar274);
  auVar37._28_4_ = fVar221;
  auVar37._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar92,
                          CONCAT48(auVar12._8_4_ * fVar127,
                                   CONCAT44(auVar12._4_4_ * fVar91,auVar12._0_4_ * fVar67))));
  auVar4 = vfmadd231ps_fma(auVar37,auVar110,ZEXT1632(auVar4));
  auVar134 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar5._12_4_,
                                                CONCAT48(fVar127 * auVar5._8_4_,
                                                         CONCAT44(fVar91 * auVar5._4_4_,
                                                                  fVar67 * auVar5._0_4_)))),auVar110
                             ,ZEXT1632(auVar134));
  local_3b8._0_4_ = auVar151._0_4_ + auVar248._0_4_;
  local_3b8._4_4_ = auVar151._4_4_ + auVar248._4_4_;
  local_3b8._8_4_ = auVar151._8_4_ + auVar248._8_4_;
  local_3b8._12_4_ = auVar151._12_4_ + auVar248._12_4_;
  local_3b8._16_4_ = auVar248._16_4_ + 0.0;
  local_3b8._20_4_ = auVar248._20_4_ + 0.0;
  local_3b8._24_4_ = auVar248._24_4_ + 0.0;
  local_3b8._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar92,
                                               CONCAT48(auVar6._8_4_ * fVar127,
                                                        CONCAT44(auVar6._4_4_ * fVar91,
                                                                 auVar6._0_4_ * fVar67)))),auVar110,
                            ZEXT1632(auVar12));
  auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar243._12_4_ * fVar92,
                                              CONCAT48(auVar243._8_4_ * fVar127,
                                                       CONCAT44(auVar243._4_4_ * fVar91,
                                                                auVar243._0_4_ * fVar67)))),auVar110
                           ,ZEXT1632(auVar5));
  auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar12._12_4_,
                                              CONCAT48(fVar127 * auVar12._8_4_,
                                                       CONCAT44(fVar91 * auVar12._4_4_,
                                                                fVar67 * auVar12._0_4_)))),auVar110,
                           ZEXT1632(auVar4));
  auVar243 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar92,
                                                CONCAT48(auVar5._8_4_ * fVar127,
                                                         CONCAT44(auVar5._4_4_ * fVar91,
                                                                  auVar5._0_4_ * fVar67)))),
                             ZEXT1632(auVar134),auVar110);
  auVar110 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
  auVar13 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar134));
  auVar266._0_4_ = fStack_140 * auVar110._0_4_ * 3.0;
  auVar266._4_4_ = fStack_140 * auVar110._4_4_ * 3.0;
  auVar266._8_4_ = fStack_140 * auVar110._8_4_ * 3.0;
  auVar266._12_4_ = fStack_140 * auVar110._12_4_ * 3.0;
  auVar266._16_4_ = fStack_140 * auVar110._16_4_ * 3.0;
  auVar266._20_4_ = fStack_140 * auVar110._20_4_ * 3.0;
  auVar266._24_4_ = fStack_140 * auVar110._24_4_ * 3.0;
  auVar266._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar38._4_4_ = fStack_154;
  auVar38._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar38._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar38._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar38._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar38._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar38._24_4_ = fStack_140;
  auVar38._28_4_ = 0x40400000;
  _local_368 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar6));
  local_2c8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar243));
  auVar110 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar151));
  auVar13 = vsubps_avx(ZEXT1632(auVar243),ZEXT1632(auVar158));
  auVar14 = vsubps_avx(_local_368,local_348);
  fVar184 = auVar110._0_4_ + auVar14._0_4_;
  fVar196 = auVar110._4_4_ + auVar14._4_4_;
  fVar197 = auVar110._8_4_ + auVar14._8_4_;
  fVar198 = auVar110._12_4_ + auVar14._12_4_;
  fVar149 = auVar110._16_4_ + auVar14._16_4_;
  fVar168 = auVar110._20_4_ + auVar14._20_4_;
  fVar169 = auVar110._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_2c8,auVar17);
  auVar88._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar88._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar88._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar88._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar88._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar88._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar88._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar88._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar158);
  fVar67 = auVar158._0_4_;
  local_178 = (float)local_328._0_4_ + fVar67;
  fVar91 = auVar158._4_4_;
  fStack_174 = (float)local_328._4_4_ + fVar91;
  fVar127 = auVar158._8_4_;
  fStack_170 = fStack_320 + fVar127;
  fVar92 = auVar158._12_4_;
  fStack_16c = fStack_31c + fVar92;
  fStack_168 = fStack_318 + 0.0;
  fStack_164 = fStack_314 + 0.0;
  fStack_160 = fStack_310 + 0.0;
  local_b8 = ZEXT1632(auVar151);
  auVar13 = vsubps_avx(local_b8,auVar248);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_328);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar6._0_4_ + auVar266._0_4_;
  local_118._4_4_ = auVar6._4_4_ + auVar266._4_4_;
  local_118._8_4_ = auVar6._8_4_ + auVar266._8_4_;
  local_118._12_4_ = auVar6._12_4_ + auVar266._12_4_;
  local_118._16_4_ = auVar266._16_4_ + 0.0;
  local_118._20_4_ = auVar266._20_4_ + 0.0;
  local_118._24_4_ = auVar266._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar249 = ZEXT1632(auVar6);
  auVar13 = vsubps_avx(auVar249,auVar266);
  auVar18 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar93 = auVar243._0_4_;
  local_158 = fVar93 + local_158;
  fVar68 = auVar243._4_4_;
  fStack_154 = fVar68 + fStack_154;
  fVar150 = auVar243._8_4_;
  fStack_150 = fVar150 + fStack_150;
  fVar221 = auVar243._12_4_;
  fStack_14c = fVar221 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar243),auVar38);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar39._4_4_ = fVar91 * fVar196;
  auVar39._0_4_ = fVar67 * fVar184;
  auVar39._8_4_ = fVar127 * fVar197;
  auVar39._12_4_ = fVar92 * fVar198;
  auVar39._16_4_ = fVar149 * 0.0;
  auVar39._20_4_ = fVar168 * 0.0;
  auVar39._24_4_ = fVar169 * 0.0;
  auVar39._28_4_ = auVar13._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar39,local_b8,auVar88);
  fStack_15c = fStack_30c + 0.0;
  auVar40._4_4_ = fStack_174 * fVar196;
  auVar40._0_4_ = local_178 * fVar184;
  auVar40._8_4_ = fStack_170 * fVar197;
  auVar40._12_4_ = fStack_16c * fVar198;
  auVar40._16_4_ = fStack_168 * fVar149;
  auVar40._20_4_ = fStack_164 * fVar168;
  auVar40._24_4_ = fStack_160 * fVar169;
  auVar40._28_4_ = 0;
  auVar4 = vfnmadd231ps_fma(auVar40,auVar88,local_3b8);
  auVar41._4_4_ = local_198._4_4_ * fVar196;
  auVar41._0_4_ = local_198._0_4_ * fVar184;
  auVar41._8_4_ = local_198._8_4_ * fVar197;
  auVar41._12_4_ = local_198._12_4_ * fVar198;
  auVar41._16_4_ = local_198._16_4_ * fVar149;
  auVar41._20_4_ = local_198._20_4_ * fVar168;
  auVar41._24_4_ = local_198._24_4_ * fVar169;
  auVar41._28_4_ = fStack_30c + 0.0;
  auVar134 = vfnmadd231ps_fma(auVar41,local_d8,auVar88);
  local_538._0_4_ = auVar17._0_4_;
  local_538._4_4_ = auVar17._4_4_;
  uStack_530._0_4_ = auVar17._8_4_;
  uStack_530._4_4_ = auVar17._12_4_;
  uStack_528._0_4_ = auVar17._16_4_;
  uStack_528._4_4_ = auVar17._20_4_;
  uStack_520._0_4_ = auVar17._24_4_;
  uStack_520._4_4_ = auVar17._28_4_;
  auVar42._4_4_ = (float)local_538._4_4_ * fVar196;
  auVar42._0_4_ = (float)local_538._0_4_ * fVar184;
  auVar42._8_4_ = (float)uStack_530 * fVar197;
  auVar42._12_4_ = uStack_530._4_4_ * fVar198;
  auVar42._16_4_ = (float)uStack_528 * fVar149;
  auVar42._20_4_ = uStack_528._4_4_ * fVar168;
  auVar42._24_4_ = (float)uStack_520 * fVar169;
  auVar42._28_4_ = uStack_520._4_4_;
  auVar5 = vfnmadd231ps_fma(auVar42,local_348,auVar88);
  auVar206._0_4_ = fVar93 * fVar184;
  auVar206._4_4_ = fVar68 * fVar196;
  auVar206._8_4_ = fVar150 * fVar197;
  auVar206._12_4_ = fVar221 * fVar198;
  auVar206._16_4_ = fVar149 * 0.0;
  auVar206._20_4_ = fVar168 * 0.0;
  auVar206._24_4_ = fVar169 * 0.0;
  auVar206._28_4_ = 0;
  auVar6 = vfnmadd231ps_fma(auVar206,auVar249,auVar88);
  uStack_13c = 0x40400000;
  auVar43._4_4_ = fStack_154 * fVar196;
  auVar43._0_4_ = local_158 * fVar184;
  auVar43._8_4_ = fStack_150 * fVar197;
  auVar43._12_4_ = fStack_14c * fVar198;
  auVar43._16_4_ = fStack_148 * fVar149;
  auVar43._20_4_ = fStack_144 * fVar168;
  auVar43._24_4_ = fStack_140 * fVar169;
  auVar43._28_4_ = local_348._28_4_;
  auVar158 = vfnmadd231ps_fma(auVar43,local_118,auVar88);
  auVar44._4_4_ = local_138._4_4_ * fVar196;
  auVar44._0_4_ = local_138._0_4_ * fVar184;
  auVar44._8_4_ = local_138._8_4_ * fVar197;
  auVar44._12_4_ = local_138._12_4_ * fVar198;
  auVar44._16_4_ = local_138._16_4_ * fVar149;
  auVar44._20_4_ = local_138._20_4_ * fVar168;
  auVar44._24_4_ = local_138._24_4_ * fVar169;
  auVar44._28_4_ = local_138._28_4_;
  _local_328 = auVar18;
  auVar202 = vfnmadd231ps_fma(auVar44,auVar18,auVar88);
  auVar45._4_4_ = local_2c8._4_4_ * fVar196;
  auVar45._0_4_ = local_2c8._0_4_ * fVar184;
  auVar45._8_4_ = local_2c8._8_4_ * fVar197;
  auVar45._12_4_ = local_2c8._12_4_ * fVar198;
  auVar45._16_4_ = local_2c8._16_4_ * fVar149;
  auVar45._20_4_ = local_2c8._20_4_ * fVar168;
  auVar45._24_4_ = local_2c8._24_4_ * fVar169;
  auVar45._28_4_ = auVar110._28_4_ + auVar14._28_4_;
  auVar220 = ZEXT3264(_local_368);
  auVar236 = vfnmadd231ps_fma(auVar45,_local_368,auVar88);
  auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
  auVar110 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar4));
  auVar14 = vminps_avx(ZEXT1632(auVar134),ZEXT1632(auVar5));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar134),ZEXT1632(auVar5));
  auVar110 = vmaxps_avx(auVar110,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar158));
  auVar13 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar158));
  auVar16 = vminps_avx(ZEXT1632(auVar202),ZEXT1632(auVar236));
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar202),ZEXT1632(auVar236));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar110,auVar13);
  auVar55._4_4_ = fStack_74;
  auVar55._0_4_ = local_78;
  auVar55._8_4_ = fStack_70;
  auVar55._12_4_ = fStack_6c;
  auVar55._16_4_ = fStack_68;
  auVar55._20_4_ = fStack_64;
  auVar55._24_4_ = fStack_60;
  auVar55._28_4_ = fStack_5c;
  auVar110 = vcmpps_avx(auVar15,auVar55,2);
  auVar54._4_4_ = fStack_94;
  auVar54._0_4_ = local_98;
  auVar54._8_4_ = fStack_90;
  auVar54._12_4_ = fStack_8c;
  auVar54._16_4_ = fStack_88;
  auVar54._20_4_ = fStack_84;
  auVar54._24_4_ = fStack_80;
  auVar54._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar54,5);
  auVar110 = vandps_avx(auVar13,auVar110);
  auVar13 = local_1b8 & auVar110;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_348,local_b8);
    auVar14 = vsubps_avx(_local_368,auVar249);
    fVar196 = auVar13._0_4_ + auVar14._0_4_;
    fVar197 = auVar13._4_4_ + auVar14._4_4_;
    fVar198 = auVar13._8_4_ + auVar14._8_4_;
    fVar149 = auVar13._12_4_ + auVar14._12_4_;
    fVar168 = auVar13._16_4_ + auVar14._16_4_;
    fVar169 = auVar13._20_4_ + auVar14._20_4_;
    fVar170 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(auVar17,local_f8);
    auVar16 = vsubps_avx(local_2c8,ZEXT1632(auVar243));
    auVar112._0_4_ = auVar15._0_4_ + auVar16._0_4_;
    auVar112._4_4_ = auVar15._4_4_ + auVar16._4_4_;
    auVar112._8_4_ = auVar15._8_4_ + auVar16._8_4_;
    auVar112._12_4_ = auVar15._12_4_ + auVar16._12_4_;
    auVar112._16_4_ = auVar15._16_4_ + auVar16._16_4_;
    auVar112._20_4_ = auVar15._20_4_ + auVar16._20_4_;
    auVar112._24_4_ = auVar15._24_4_ + auVar16._24_4_;
    fVar184 = auVar16._28_4_;
    auVar112._28_4_ = auVar15._28_4_ + fVar184;
    auVar46._4_4_ = fVar91 * fVar197;
    auVar46._0_4_ = fVar67 * fVar196;
    auVar46._8_4_ = fVar127 * fVar198;
    auVar46._12_4_ = fVar92 * fVar149;
    auVar46._16_4_ = fVar168 * 0.0;
    auVar46._20_4_ = fVar169 * 0.0;
    auVar46._24_4_ = fVar170 * 0.0;
    auVar46._28_4_ = local_2c8._28_4_;
    auVar6 = vfnmadd231ps_fma(auVar46,auVar112,local_b8);
    auVar47._4_4_ = fVar197 * fStack_174;
    auVar47._0_4_ = fVar196 * local_178;
    auVar47._8_4_ = fVar198 * fStack_170;
    auVar47._12_4_ = fVar149 * fStack_16c;
    auVar47._16_4_ = fVar168 * fStack_168;
    auVar47._20_4_ = fVar169 * fStack_164;
    auVar47._24_4_ = fVar170 * fStack_160;
    auVar47._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_3b8,auVar112,auVar47);
    auVar48._4_4_ = fVar197 * local_198._4_4_;
    auVar48._0_4_ = fVar196 * local_198._0_4_;
    auVar48._8_4_ = fVar198 * local_198._8_4_;
    auVar48._12_4_ = fVar149 * local_198._12_4_;
    auVar48._16_4_ = fVar168 * local_198._16_4_;
    auVar48._20_4_ = fVar169 * local_198._20_4_;
    auVar48._24_4_ = fVar170 * local_198._24_4_;
    auVar48._28_4_ = 0;
    auVar4 = vfnmadd213ps_fma(local_d8,auVar112,auVar48);
    auVar49._4_4_ = (float)local_538._4_4_ * fVar197;
    auVar49._0_4_ = (float)local_538._0_4_ * fVar196;
    auVar49._8_4_ = (float)uStack_530 * fVar198;
    auVar49._12_4_ = uStack_530._4_4_ * fVar149;
    auVar49._16_4_ = (float)uStack_528 * fVar168;
    auVar49._20_4_ = uStack_528._4_4_ * fVar169;
    auVar49._24_4_ = (float)uStack_520 * fVar170;
    auVar49._28_4_ = 0;
    auVar243 = vfnmadd231ps_fma(auVar49,auVar112,local_348);
    auVar138._0_4_ = fVar93 * fVar196;
    auVar138._4_4_ = fVar68 * fVar197;
    auVar138._8_4_ = fVar150 * fVar198;
    auVar138._12_4_ = fVar221 * fVar149;
    auVar138._16_4_ = fVar168 * 0.0;
    auVar138._20_4_ = fVar169 * 0.0;
    auVar138._24_4_ = fVar170 * 0.0;
    auVar138._28_4_ = 0;
    auVar158 = vfnmadd231ps_fma(auVar138,auVar112,auVar249);
    auVar50._4_4_ = fVar197 * fStack_154;
    auVar50._0_4_ = fVar196 * local_158;
    auVar50._8_4_ = fVar198 * fStack_150;
    auVar50._12_4_ = fVar149 * fStack_14c;
    auVar50._16_4_ = fVar168 * fStack_148;
    auVar50._20_4_ = fVar169 * fStack_144;
    auVar50._24_4_ = fVar170 * fStack_140;
    auVar50._28_4_ = fVar184;
    auVar134 = vfnmadd213ps_fma(local_118,auVar112,auVar50);
    auVar51._4_4_ = fVar197 * local_138._4_4_;
    auVar51._0_4_ = fVar196 * local_138._0_4_;
    auVar51._8_4_ = fVar198 * local_138._8_4_;
    auVar51._12_4_ = fVar149 * local_138._12_4_;
    auVar51._16_4_ = fVar168 * local_138._16_4_;
    auVar51._20_4_ = fVar169 * local_138._20_4_;
    auVar51._24_4_ = fVar170 * local_138._24_4_;
    auVar51._28_4_ = fVar184;
    auVar5 = vfnmadd213ps_fma(auVar18,auVar112,auVar51);
    auVar220 = ZEXT1664(auVar5);
    auVar52._4_4_ = fVar197 * local_2c8._4_4_;
    auVar52._0_4_ = fVar196 * local_2c8._0_4_;
    auVar52._8_4_ = fVar198 * local_2c8._8_4_;
    auVar52._12_4_ = fVar149 * local_2c8._12_4_;
    auVar52._16_4_ = fVar168 * local_2c8._16_4_;
    auVar52._20_4_ = fVar169 * local_2c8._20_4_;
    auVar52._24_4_ = fVar170 * local_2c8._24_4_;
    auVar52._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar202 = vfnmadd231ps_fma(auVar52,auVar112,_local_368);
    auVar14 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
    auVar13 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
    auVar15 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar243));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar243));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar158),ZEXT1632(auVar134));
    auVar14 = vmaxps_avx(ZEXT1632(auVar158),ZEXT1632(auVar134));
    auVar17 = vminps_avx(ZEXT1632(auVar5),ZEXT1632(auVar202));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar202));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar16,auVar55,2);
    auVar14 = vcmpps_avx(auVar14,auVar54,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar110 = vandps_avx(auVar110,local_1b8);
    auVar14 = auVar110 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar110 = vandps_avx(auVar13,auVar110);
      uVar56 = vmovmskps_avx(auVar110);
      if (uVar56 != 0) {
        auStack_308[uVar63] = uVar56 & 0xff;
        uVar94 = vmovlps_avx(local_268);
        *(undefined8 *)(&uStack_1f8 + uVar63 * 2) = uVar94;
        uVar66 = vmovlps_avx(auVar76);
        auStack_58[uVar63] = uVar66;
        uVar63 = (ulong)((int)uVar63 + 1);
      }
    }
  }
LAB_0135764e:
  if ((int)uVar63 == 0) {
    fVar67 = (ray->super_RayK<1>).tfar;
    auVar90._4_4_ = fVar67;
    auVar90._0_4_ = fVar67;
    auVar90._8_4_ = fVar67;
    auVar90._12_4_ = fVar67;
    auVar90._16_4_ = fVar67;
    auVar90._20_4_ = fVar67;
    auVar90._24_4_ = fVar67;
    auVar90._28_4_ = fVar67;
    auVar110 = vcmpps_avx(local_1d8,auVar90,2);
    uVar58 = vmovmskps_avx(auVar110);
    uVar65 = (ulong)((uint)uVar65 & uVar58);
    goto LAB_01356965;
  }
  uVar57 = (int)uVar63 - 1;
  uVar59 = (ulong)uVar57;
  uVar62 = auStack_308[uVar59];
  uVar56 = (&uStack_1f8)[uVar59 * 2];
  fVar67 = afStack_1f4[uVar59 * 2];
  iVar20 = 0;
  for (uVar66 = (ulong)uVar62; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    iVar20 = iVar20 + 1;
  }
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 == 0) {
    uVar63 = (ulong)uVar57;
  }
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auStack_58[uVar59];
  auStack_308[uVar59] = uVar62;
  fVar91 = (float)(iVar20 + 1) * 0.14285715;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * (float)iVar20 * 0.14285715)),ZEXT416(uVar56),
                            ZEXT416((uint)(1.0 - (float)iVar20 * 0.14285715)));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar67 * fVar91)),ZEXT416(uVar56),
                           ZEXT416((uint)(1.0 - fVar91)));
  fVar91 = auVar4._0_4_;
  auVar195._0_4_ = auVar12._0_4_;
  fVar67 = fVar91 - auVar195._0_4_;
  if (fVar67 < 0.16666667) {
    auVar134 = vshufps_avx(auVar76,auVar76,0x50);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar5 = vsubps_avx(auVar99,auVar134);
    fVar127 = auVar134._0_4_;
    auVar143._0_4_ = fVar127 * (float)local_408._0_4_;
    fVar92 = auVar134._4_4_;
    auVar143._4_4_ = fVar92 * (float)local_408._4_4_;
    fVar93 = auVar134._8_4_;
    auVar143._8_4_ = fVar93 * fStack_400;
    fVar68 = auVar134._12_4_;
    auVar143._12_4_ = fVar68 * fStack_3fc;
    auVar156._0_4_ = fVar127 * (float)local_418._0_4_;
    auVar156._4_4_ = fVar92 * (float)local_418._4_4_;
    auVar156._8_4_ = fVar93 * fStack_410;
    auVar156._12_4_ = fVar68 * fStack_40c;
    auVar180._0_4_ = fVar127 * (float)local_428._0_4_;
    auVar180._4_4_ = fVar92 * (float)local_428._4_4_;
    auVar180._8_4_ = fVar93 * fStack_420;
    auVar180._12_4_ = fVar68 * fStack_41c;
    auVar78._0_4_ = fVar127 * (float)local_438._0_4_;
    auVar78._4_4_ = fVar92 * (float)local_438._4_4_;
    auVar78._8_4_ = fVar93 * fStack_430;
    auVar78._12_4_ = fVar68 * fStack_42c;
    auVar134 = vfmadd231ps_fma(auVar143,auVar5,local_3c8);
    auVar6 = vfmadd231ps_fma(auVar156,auVar5,local_3d8);
    auVar243 = vfmadd231ps_fma(auVar180,auVar5,local_3e8);
    auVar5 = vfmadd231ps_fma(auVar78,auVar5,local_3f8);
    auVar139._16_16_ = auVar134;
    auVar139._0_16_ = auVar134;
    auVar148._16_16_ = auVar6;
    auVar148._0_16_ = auVar6;
    auVar167._16_16_ = auVar243;
    auVar167._0_16_ = auVar243;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    local_3b8._0_16_ = auVar4;
    auVar195._20_4_ = fVar91;
    auVar195._16_4_ = fVar91;
    auVar195._24_4_ = fVar91;
    auVar195._28_4_ = fVar91;
    auVar110 = vsubps_avx(auVar148,auVar139);
    auVar6 = vfmadd213ps_fma(auVar110,auVar195,auVar139);
    auVar110 = vsubps_avx(auVar167,auVar148);
    auVar158 = vfmadd213ps_fma(auVar110,auVar195,auVar148);
    auVar134 = vsubps_avx(auVar5,auVar243);
    auVar89._16_16_ = auVar134;
    auVar89._0_16_ = auVar134;
    auVar134 = vfmadd213ps_fma(auVar89,auVar195,auVar167);
    auVar110 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar6));
    auVar5 = vfmadd213ps_fma(auVar110,auVar195,ZEXT1632(auVar6));
    auVar110 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar158));
    auVar134 = vfmadd213ps_fma(auVar110,auVar195,ZEXT1632(auVar158));
    auVar110 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar5));
    auVar69 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar110,auVar195);
    fVar221 = auVar110._4_4_ * 3.0;
    local_348._0_4_ = fVar67;
    fVar127 = fVar67 * 0.33333334;
    local_2c8._0_8_ =
         CONCAT44(auVar69._4_4_ + fVar127 * fVar221,auVar69._0_4_ + fVar127 * auVar110._0_4_ * 3.0);
    local_2c8._8_4_ = auVar69._8_4_ + fVar127 * auVar110._8_4_ * 3.0;
    local_2c8._12_4_ = auVar69._12_4_ + fVar127 * auVar110._12_4_ * 3.0;
    auVar5 = vshufpd_avx(auVar69,auVar69,3);
    auVar6 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_368 = auVar5;
    auVar134 = vsubps_avx(auVar5,auVar69);
    auVar243 = vsubps_avx(auVar6,(undefined1  [16])0x0);
    auVar79._0_4_ = auVar134._0_4_ + auVar243._0_4_;
    auVar79._4_4_ = auVar134._4_4_ + auVar243._4_4_;
    auVar79._8_4_ = auVar134._8_4_ + auVar243._8_4_;
    auVar79._12_4_ = auVar134._12_4_ + auVar243._12_4_;
    auVar134 = vshufps_avx(auVar69,auVar69,0xb1);
    auVar243 = vshufps_avx(local_2c8._0_16_,local_2c8._0_16_,0xb1);
    auVar260._4_4_ = auVar79._0_4_;
    auVar260._0_4_ = auVar79._0_4_;
    auVar260._8_4_ = auVar79._0_4_;
    auVar260._12_4_ = auVar79._0_4_;
    auVar158 = vshufps_avx(auVar79,auVar79,0x55);
    fVar92 = auVar158._0_4_;
    auVar80._0_4_ = fVar92 * auVar134._0_4_;
    fVar93 = auVar158._4_4_;
    auVar80._4_4_ = fVar93 * auVar134._4_4_;
    fVar68 = auVar158._8_4_;
    auVar80._8_4_ = fVar68 * auVar134._8_4_;
    fVar150 = auVar158._12_4_;
    auVar80._12_4_ = fVar150 * auVar134._12_4_;
    auVar157._0_4_ = fVar92 * auVar243._0_4_;
    auVar157._4_4_ = fVar93 * auVar243._4_4_;
    auVar157._8_4_ = fVar68 * auVar243._8_4_;
    auVar157._12_4_ = fVar150 * auVar243._12_4_;
    auVar202 = vfmadd231ps_fma(auVar80,auVar260,auVar69);
    auVar236 = vfmadd231ps_fma(auVar157,auVar260,local_2c8._0_16_);
    auVar243 = vshufps_avx(auVar202,auVar202,0xe8);
    auVar158 = vshufps_avx(auVar236,auVar236,0xe8);
    auVar134 = vcmpps_avx(auVar243,auVar158,1);
    uVar56 = vextractps_avx(auVar134,0);
    auVar151 = auVar236;
    if ((uVar56 & 1) == 0) {
      auVar151 = auVar202;
    }
    auVar130._0_4_ = fVar127 * auVar110._16_4_ * 3.0;
    auVar130._4_4_ = fVar127 * fVar221;
    auVar130._8_4_ = fVar127 * auVar110._24_4_ * 3.0;
    auVar130._12_4_ = fVar127 * auVar220._28_4_;
    auVar71 = vsubps_avx((undefined1  [16])0x0,auVar130);
    auVar131 = vshufps_avx(auVar71,auVar71,0xb1);
    auVar70 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar187._0_4_ = fVar92 * auVar131._0_4_;
    auVar187._4_4_ = fVar93 * auVar131._4_4_;
    auVar187._8_4_ = fVar68 * auVar131._8_4_;
    auVar187._12_4_ = fVar150 * auVar131._12_4_;
    auVar201._0_4_ = auVar70._0_4_ * fVar92;
    auVar201._4_4_ = auVar70._4_4_ * fVar93;
    auVar201._8_4_ = auVar70._8_4_ * fVar68;
    auVar201._12_4_ = auVar70._12_4_ * fVar150;
    _local_328 = auVar71;
    auVar21 = vfmadd231ps_fma(auVar187,auVar260,auVar71);
    auVar73 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar260);
    auVar70 = vshufps_avx(auVar21,auVar21,0xe8);
    auVar72 = vshufps_avx(auVar73,auVar73,0xe8);
    auVar220 = ZEXT1664(auVar72);
    auVar131 = vcmpps_avx(auVar70,auVar72,1);
    uVar56 = vextractps_avx(auVar131,0);
    auVar74 = auVar73;
    if ((uVar56 & 1) == 0) {
      auVar74 = auVar21;
    }
    auVar151 = vmaxss_avx(auVar74,auVar151);
    auVar243 = vminps_avx(auVar243,auVar158);
    auVar158 = vminps_avx(auVar70,auVar72);
    auVar158 = vminps_avx(auVar243,auVar158);
    auVar134 = vshufps_avx(auVar134,auVar134,0x55);
    auVar134 = vblendps_avx(auVar134,auVar131,2);
    auVar131 = vpslld_avx(auVar134,0x1f);
    auVar134 = vshufpd_avx(auVar236,auVar236,1);
    auVar134 = vinsertps_avx(auVar134,auVar73,0x9c);
    auVar243 = vshufpd_avx(auVar202,auVar202,1);
    auVar243 = vinsertps_avx(auVar243,auVar21,0x9c);
    auVar134 = vblendvps_avx(auVar243,auVar134,auVar131);
    auVar243 = vmovshdup_avx(auVar134);
    auVar134 = vmaxss_avx(auVar243,auVar134);
    fVar68 = auVar158._0_4_;
    auVar243 = vmovshdup_avx(auVar158);
    fVar93 = auVar134._0_4_;
    fVar127 = auVar243._0_4_;
    fVar92 = auVar151._0_4_;
    if (((0.0001 <= fVar68) || (fVar93 <= -0.0001)) && (0.0001 <= fVar127 || fVar93 <= -0.0001))
    goto code_r0x01357958;
    goto LAB_0135797e;
  }
  local_268 = vinsertps_avx(auVar12,auVar4,0x10);
  goto LAB_013570a3;
code_r0x01357958:
  auVar243 = vcmpps_avx(auVar243,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar202 = vcmpps_avx(auVar158,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar243 = vandps_avx(auVar202,auVar243);
  if (fVar92 <= -0.0001 || (auVar243 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0135764e;
LAB_0135797e:
  auVar220 = ZEXT1664(auVar6);
  auVar202 = vcmpps_avx(auVar158,_DAT_01f45a50,1);
  auVar236 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar243 = vcmpss_avx(auVar151,ZEXT816(0) << 0x20,1);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar243 = vblendvps_avx(auVar100,auVar117,auVar243);
  auVar202 = vblendvps_avx(auVar100,auVar117,auVar202);
  fVar221 = auVar202._0_4_;
  fVar150 = auVar243._0_4_;
  auVar243 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar221 == fVar150) && (!NAN(fVar221) && !NAN(fVar150))) {
    auVar243 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar221 == fVar150) && (!NAN(fVar221) && !NAN(fVar150))) {
    auVar236 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar202 = vmovshdup_avx(auVar202);
  fVar184 = auVar202._0_4_;
  auVar202 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar221 != fVar184) || (NAN(fVar221) || NAN(fVar184))) {
    if ((fVar127 != fVar68) || (NAN(fVar127) || NAN(fVar68))) {
      auVar132._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
      auVar132._8_4_ = auVar158._8_4_ ^ 0x80000000;
      auVar132._12_4_ = auVar158._12_4_ ^ 0x80000000;
      auVar133._0_4_ = -fVar68 / (fVar127 - fVar68);
      auVar133._4_12_ = auVar132._4_12_;
      auVar158 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar133,ZEXT416(0));
      auVar131 = auVar158;
    }
    else {
      auVar158 = ZEXT816(0) << 0x20;
      if ((fVar68 != 0.0) || (auVar131 = auVar202, NAN(fVar68))) {
        auVar158 = SUB6416(ZEXT464(0x7f800000),0);
        auVar131 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar243 = vminss_avx(auVar243,auVar158);
    auVar236 = vmaxss_avx(auVar131,auVar236);
  }
  auVar134 = vcmpss_avx(auVar134,ZEXT416(0),1);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar118._8_4_ = 0xbf800000;
  auVar118._0_8_ = 0xbf800000bf800000;
  auVar118._12_4_ = 0xbf800000;
  auVar134 = vblendvps_avx(auVar101,auVar118,auVar134);
  fVar127 = auVar134._0_4_;
  if ((fVar150 != fVar127) || (NAN(fVar150) || NAN(fVar127))) {
    if ((fVar93 != fVar92) || (NAN(fVar93) || NAN(fVar92))) {
      auVar81._0_8_ = auVar151._0_8_ ^ 0x8000000080000000;
      auVar81._8_4_ = auVar151._8_4_ ^ 0x80000000;
      auVar81._12_4_ = auVar151._12_4_ ^ 0x80000000;
      auVar135._0_4_ = -fVar92 / (fVar93 - fVar92);
      auVar135._4_12_ = auVar81._4_12_;
      auVar134 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar135._0_4_)),auVar135,ZEXT416(0));
      auVar158 = auVar134;
    }
    else if ((fVar92 != 0.0) ||
            (auVar134 = auVar202, auVar158 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
      auVar134 = SUB6416(ZEXT464(0xff800000),0);
      auVar158 = SUB6416(ZEXT464(0x7f800000),0);
    }
    auVar243 = vminss_avx(auVar243,auVar158);
    auVar236 = vmaxss_avx(auVar134,auVar236);
  }
  if ((fVar184 != fVar127) || (NAN(fVar184) || NAN(fVar127))) {
    auVar243 = vminss_avx(auVar243,auVar202);
    auVar236 = vmaxss_avx(auVar202,auVar236);
  }
  auVar134 = vmaxss_avx(ZEXT816(0) << 0x40,auVar243);
  auVar243 = vminss_avx(auVar236,auVar202);
  if (auVar243._0_4_ < auVar134._0_4_) goto LAB_0135764e;
  auVar134 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar134._0_4_ + -0.1)));
  auVar243 = vminss_avx(ZEXT416((uint)(auVar243._0_4_ + 0.1)),auVar202);
  auVar144._0_8_ = auVar69._0_8_;
  auVar144._8_8_ = auVar144._0_8_;
  auVar210._8_8_ = local_2c8._0_8_;
  auVar210._0_8_ = local_2c8._0_8_;
  auVar224._8_8_ = auVar71._0_8_;
  auVar224._0_8_ = auVar71._0_8_;
  auVar158 = vshufpd_avx(local_2c8._0_16_,local_2c8._0_16_,3);
  auVar202 = vshufpd_avx(auVar71,auVar71,3);
  auVar236 = vshufps_avx(auVar134,auVar243,0);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = 0x3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar69 = vsubps_avx(auVar82,auVar236);
  local_368._0_4_ = auVar5._0_4_;
  local_368._4_4_ = auVar5._4_4_;
  fStack_360 = auVar5._8_4_;
  fStack_35c = auVar5._12_4_;
  fVar127 = auVar236._0_4_;
  auVar83._0_4_ = fVar127 * (float)local_368._0_4_;
  fVar92 = auVar236._4_4_;
  auVar83._4_4_ = fVar92 * (float)local_368._4_4_;
  fVar93 = auVar236._8_4_;
  auVar83._8_4_ = fVar93 * fStack_360;
  fVar68 = auVar236._12_4_;
  auVar83._12_4_ = fVar68 * fStack_35c;
  auVar181._0_4_ = fVar127 * auVar158._0_4_;
  auVar181._4_4_ = fVar92 * auVar158._4_4_;
  auVar181._8_4_ = fVar93 * auVar158._8_4_;
  auVar181._12_4_ = fVar68 * auVar158._12_4_;
  auVar188._0_4_ = fVar127 * auVar202._0_4_;
  auVar188._4_4_ = fVar92 * auVar202._4_4_;
  auVar188._8_4_ = fVar93 * auVar202._8_4_;
  auVar188._12_4_ = fVar68 * auVar202._12_4_;
  auVar203._0_4_ = fVar127 * auVar6._0_4_;
  auVar203._4_4_ = fVar92 * auVar6._4_4_;
  auVar203._8_4_ = fVar93 * auVar6._8_4_;
  auVar203._12_4_ = fVar68 * auVar6._12_4_;
  auVar158 = vfmadd231ps_fma(auVar83,auVar69,auVar144);
  auVar202 = vfmadd231ps_fma(auVar181,auVar69,auVar210);
  auVar236 = vfmadd231ps_fma(auVar188,auVar69,auVar224);
  auVar69 = vfmadd231ps_fma(auVar203,auVar69,ZEXT816(0));
  auVar5 = vmovshdup_avx(auVar76);
  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar134._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar134._0_4_)));
  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar243._0_4_)),auVar76,
                            ZEXT416((uint)(1.0 - auVar243._0_4_)));
  fVar127 = 1.0 / fVar67;
  auVar134 = vsubps_avx(auVar202,auVar158);
  auVar211._0_4_ = auVar134._0_4_ * 3.0;
  auVar211._4_4_ = auVar134._4_4_ * 3.0;
  auVar211._8_4_ = auVar134._8_4_ * 3.0;
  auVar211._12_4_ = auVar134._12_4_ * 3.0;
  auVar134 = vsubps_avx(auVar236,auVar202);
  auVar225._0_4_ = auVar134._0_4_ * 3.0;
  auVar225._4_4_ = auVar134._4_4_ * 3.0;
  auVar225._8_4_ = auVar134._8_4_ * 3.0;
  auVar225._12_4_ = auVar134._12_4_ * 3.0;
  auVar134 = vsubps_avx(auVar69,auVar236);
  auVar237._0_4_ = auVar134._0_4_ * 3.0;
  auVar237._4_4_ = auVar134._4_4_ * 3.0;
  auVar237._8_4_ = auVar134._8_4_ * 3.0;
  auVar237._12_4_ = auVar134._12_4_ * 3.0;
  auVar5 = vminps_avx(auVar225,auVar237);
  auVar134 = vmaxps_avx(auVar225,auVar237);
  auVar5 = vminps_avx(auVar211,auVar5);
  auVar134 = vmaxps_avx(auVar211,auVar134);
  auVar6 = vshufpd_avx(auVar5,auVar5,3);
  auVar243 = vshufpd_avx(auVar134,auVar134,3);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar134 = vmaxps_avx(auVar134,auVar243);
  auVar226._0_4_ = auVar5._0_4_ * fVar127;
  auVar226._4_4_ = auVar5._4_4_ * fVar127;
  auVar226._8_4_ = auVar5._8_4_ * fVar127;
  auVar226._12_4_ = auVar5._12_4_ * fVar127;
  auVar212._0_4_ = auVar134._0_4_ * fVar127;
  auVar212._4_4_ = auVar134._4_4_ * fVar127;
  auVar212._8_4_ = auVar134._8_4_ * fVar127;
  auVar212._12_4_ = auVar134._12_4_ * fVar127;
  fVar127 = 1.0 / (auVar71._0_4_ - auVar72._0_4_);
  auVar134 = vshufpd_avx(auVar158,auVar158,3);
  auVar5 = vshufpd_avx(auVar202,auVar202,3);
  auVar6 = vshufpd_avx(auVar236,auVar236,3);
  auVar243 = vshufpd_avx(auVar69,auVar69,3);
  auVar134 = vsubps_avx(auVar134,auVar158);
  auVar158 = vsubps_avx(auVar5,auVar202);
  auVar202 = vsubps_avx(auVar6,auVar236);
  auVar243 = vsubps_avx(auVar243,auVar69);
  auVar5 = vminps_avx(auVar134,auVar158);
  auVar134 = vmaxps_avx(auVar134,auVar158);
  auVar6 = vminps_avx(auVar202,auVar243);
  auVar6 = vminps_avx(auVar5,auVar6);
  auVar5 = vmaxps_avx(auVar202,auVar243);
  auVar134 = vmaxps_avx(auVar134,auVar5);
  auVar254._0_4_ = fVar127 * auVar6._0_4_;
  auVar254._4_4_ = fVar127 * auVar6._4_4_;
  auVar254._8_4_ = fVar127 * auVar6._8_4_;
  auVar254._12_4_ = fVar127 * auVar6._12_4_;
  auVar244._0_4_ = fVar127 * auVar134._0_4_;
  auVar244._4_4_ = fVar127 * auVar134._4_4_;
  auVar244._8_4_ = fVar127 * auVar134._8_4_;
  auVar244._12_4_ = fVar127 * auVar134._12_4_;
  auVar243 = vinsertps_avx(auVar12,auVar72,0x10);
  auVar158 = vinsertps_avx(auVar4,auVar71,0x10);
  auVar238._0_4_ = (auVar243._0_4_ + auVar158._0_4_) * 0.5;
  auVar238._4_4_ = (auVar243._4_4_ + auVar158._4_4_) * 0.5;
  auVar238._8_4_ = (auVar243._8_4_ + auVar158._8_4_) * 0.5;
  auVar238._12_4_ = (auVar243._12_4_ + auVar158._12_4_) * 0.5;
  auVar84._4_4_ = auVar238._0_4_;
  auVar84._0_4_ = auVar238._0_4_;
  auVar84._8_4_ = auVar238._0_4_;
  auVar84._12_4_ = auVar238._0_4_;
  auVar134 = vfmadd213ps_fma(local_208,auVar84,local_4d8);
  auVar5 = vfmadd213ps_fma(local_218,auVar84,local_4e8);
  auVar6 = vfmadd213ps_fma(local_228,auVar84,local_4f8);
  auVar4 = vsubps_avx(auVar5,auVar134);
  auVar134 = vfmadd213ps_fma(auVar4,auVar84,auVar134);
  auVar4 = vsubps_avx(auVar6,auVar5);
  auVar4 = vfmadd213ps_fma(auVar4,auVar84,auVar5);
  auVar4 = vsubps_avx(auVar4,auVar134);
  auVar134 = vfmadd231ps_fma(auVar134,auVar4,auVar84);
  auVar85._0_8_ = CONCAT44(auVar4._4_4_ * 3.0,auVar4._0_4_ * 3.0);
  auVar85._8_4_ = auVar4._8_4_ * 3.0;
  auVar85._12_4_ = auVar4._12_4_ * 3.0;
  auVar261._8_8_ = auVar134._0_8_;
  auVar261._0_8_ = auVar134._0_8_;
  auVar4 = vshufpd_avx(auVar134,auVar134,3);
  auVar134 = vshufps_avx(auVar238,auVar238,0x55);
  auVar236 = vsubps_avx(auVar4,auVar261);
  auVar151 = vfmadd231ps_fma(auVar261,auVar134,auVar236);
  auVar269._8_8_ = auVar85._0_8_;
  auVar269._0_8_ = auVar85._0_8_;
  auVar4 = vshufpd_avx(auVar85,auVar85,3);
  auVar4 = vsubps_avx(auVar4,auVar269);
  auVar69 = vfmadd213ps_fma(auVar4,auVar134,auVar269);
  auVar134 = vmovshdup_avx(auVar69);
  auVar270._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
  auVar270._8_4_ = auVar134._8_4_ ^ 0x80000000;
  auVar270._12_4_ = auVar134._12_4_ ^ 0x80000000;
  auVar5 = vmovshdup_avx(auVar236);
  auVar4 = vunpcklps_avx(auVar5,auVar270);
  auVar6 = vshufps_avx(auVar4,auVar270,4);
  auVar202 = vshufps_avx(auVar238,auVar238,0x54);
  auVar136._0_8_ = auVar236._0_8_ ^ 0x8000000080000000;
  auVar136._8_4_ = auVar236._8_4_ ^ 0x80000000;
  auVar136._12_4_ = auVar236._12_4_ ^ 0x80000000;
  auVar4 = vmovlhps_avx(auVar136,auVar69);
  auVar4 = vshufps_avx(auVar4,auVar69,8);
  auVar134 = vfmsub231ss_fma(ZEXT416((uint)(auVar236._0_4_ * auVar134._0_4_)),auVar5,auVar69);
  uVar64 = auVar134._0_4_;
  auVar86._4_4_ = uVar64;
  auVar86._0_4_ = uVar64;
  auVar86._8_4_ = uVar64;
  auVar86._12_4_ = uVar64;
  auVar134 = vdivps_avx(auVar6,auVar86);
  auVar5 = vdivps_avx(auVar4,auVar86);
  fVar93 = auVar151._0_4_;
  fVar127 = auVar134._0_4_;
  auVar4 = vshufps_avx(auVar151,auVar151,0x55);
  fVar92 = auVar5._0_4_;
  auVar87._0_4_ = fVar93 * fVar127 + auVar4._0_4_ * fVar92;
  auVar87._4_4_ = fVar93 * auVar134._4_4_ + auVar4._4_4_ * auVar5._4_4_;
  auVar87._8_4_ = fVar93 * auVar134._8_4_ + auVar4._8_4_ * auVar5._8_4_;
  auVar87._12_4_ = fVar93 * auVar134._12_4_ + auVar4._12_4_ * auVar5._12_4_;
  auVar70 = vsubps_avx(auVar202,auVar87);
  auVar202 = vmovshdup_avx(auVar134);
  auVar4 = vinsertps_avx(auVar226,auVar254,0x1c);
  auVar159._0_4_ = auVar202._0_4_ * auVar4._0_4_;
  auVar159._4_4_ = auVar202._4_4_ * auVar4._4_4_;
  auVar159._8_4_ = auVar202._8_4_ * auVar4._8_4_;
  auVar159._12_4_ = auVar202._12_4_ * auVar4._12_4_;
  auVar6 = vinsertps_avx(auVar212,auVar244,0x1c);
  auVar102._0_4_ = auVar6._0_4_ * auVar202._0_4_;
  auVar102._4_4_ = auVar6._4_4_ * auVar202._4_4_;
  auVar102._8_4_ = auVar6._8_4_ * auVar202._8_4_;
  auVar102._12_4_ = auVar6._12_4_ * auVar202._12_4_;
  auVar151 = vminps_avx(auVar159,auVar102);
  auVar69 = vmaxps_avx(auVar102,auVar159);
  auVar202 = vinsertps_avx(auVar254,auVar226,0x4c);
  auVar76 = vmovshdup_avx(auVar5);
  auVar236 = vinsertps_avx(auVar244,auVar212,0x4c);
  auVar245._0_4_ = auVar76._0_4_ * auVar202._0_4_;
  auVar245._4_4_ = auVar76._4_4_ * auVar202._4_4_;
  auVar245._8_4_ = auVar76._8_4_ * auVar202._8_4_;
  auVar245._12_4_ = auVar76._12_4_ * auVar202._12_4_;
  auVar227._0_4_ = auVar76._0_4_ * auVar236._0_4_;
  auVar227._4_4_ = auVar76._4_4_ * auVar236._4_4_;
  auVar227._8_4_ = auVar76._8_4_ * auVar236._8_4_;
  auVar227._12_4_ = auVar76._12_4_ * auVar236._12_4_;
  auVar76 = vminps_avx(auVar245,auVar227);
  auVar255._0_4_ = auVar151._0_4_ + auVar76._0_4_;
  auVar255._4_4_ = auVar151._4_4_ + auVar76._4_4_;
  auVar255._8_4_ = auVar151._8_4_ + auVar76._8_4_;
  auVar255._12_4_ = auVar151._12_4_ + auVar76._12_4_;
  auVar151 = vmaxps_avx(auVar227,auVar245);
  auVar103._0_4_ = auVar151._0_4_ + auVar69._0_4_;
  auVar103._4_4_ = auVar151._4_4_ + auVar69._4_4_;
  auVar103._8_4_ = auVar151._8_4_ + auVar69._8_4_;
  auVar103._12_4_ = auVar151._12_4_ + auVar69._12_4_;
  auVar228._8_8_ = 0x3f80000000000000;
  auVar228._0_8_ = 0x3f80000000000000;
  auVar69 = vsubps_avx(auVar228,auVar103);
  auVar151 = vsubps_avx(auVar228,auVar255);
  auVar76 = vsubps_avx(auVar243,auVar238);
  auVar131 = vsubps_avx(auVar158,auVar238);
  auVar119._0_4_ = fVar127 * auVar4._0_4_;
  auVar119._4_4_ = fVar127 * auVar4._4_4_;
  auVar119._8_4_ = fVar127 * auVar4._8_4_;
  auVar119._12_4_ = fVar127 * auVar4._12_4_;
  auVar256._0_4_ = fVar127 * auVar6._0_4_;
  auVar256._4_4_ = fVar127 * auVar6._4_4_;
  auVar256._8_4_ = fVar127 * auVar6._8_4_;
  auVar256._12_4_ = fVar127 * auVar6._12_4_;
  auVar6 = vminps_avx(auVar119,auVar256);
  auVar4 = vmaxps_avx(auVar256,auVar119);
  auVar160._0_4_ = fVar92 * auVar202._0_4_;
  auVar160._4_4_ = fVar92 * auVar202._4_4_;
  auVar160._8_4_ = fVar92 * auVar202._8_4_;
  auVar160._12_4_ = fVar92 * auVar202._12_4_;
  auVar213._0_4_ = fVar92 * auVar236._0_4_;
  auVar213._4_4_ = fVar92 * auVar236._4_4_;
  auVar213._8_4_ = fVar92 * auVar236._8_4_;
  auVar213._12_4_ = fVar92 * auVar236._12_4_;
  auVar202 = vminps_avx(auVar160,auVar213);
  auVar257._0_4_ = auVar6._0_4_ + auVar202._0_4_;
  auVar257._4_4_ = auVar6._4_4_ + auVar202._4_4_;
  auVar257._8_4_ = auVar6._8_4_ + auVar202._8_4_;
  auVar257._12_4_ = auVar6._12_4_ + auVar202._12_4_;
  fVar184 = auVar76._0_4_;
  auVar262._0_4_ = fVar184 * auVar69._0_4_;
  fVar196 = auVar76._4_4_;
  auVar262._4_4_ = fVar196 * auVar69._4_4_;
  fVar197 = auVar76._8_4_;
  auVar262._8_4_ = fVar197 * auVar69._8_4_;
  fVar198 = auVar76._12_4_;
  auVar262._12_4_ = fVar198 * auVar69._12_4_;
  auVar6 = vmaxps_avx(auVar213,auVar160);
  auVar214._0_4_ = fVar184 * auVar151._0_4_;
  auVar214._4_4_ = fVar196 * auVar151._4_4_;
  auVar214._8_4_ = fVar197 * auVar151._8_4_;
  auVar214._12_4_ = fVar198 * auVar151._12_4_;
  fVar93 = auVar131._0_4_;
  auVar104._0_4_ = fVar93 * auVar69._0_4_;
  fVar68 = auVar131._4_4_;
  auVar104._4_4_ = fVar68 * auVar69._4_4_;
  fVar150 = auVar131._8_4_;
  auVar104._8_4_ = fVar150 * auVar69._8_4_;
  fVar221 = auVar131._12_4_;
  auVar104._12_4_ = fVar221 * auVar69._12_4_;
  auVar229._0_4_ = fVar93 * auVar151._0_4_;
  auVar229._4_4_ = fVar68 * auVar151._4_4_;
  auVar229._8_4_ = fVar150 * auVar151._8_4_;
  auVar229._12_4_ = fVar221 * auVar151._12_4_;
  auVar120._0_4_ = auVar4._0_4_ + auVar6._0_4_;
  auVar120._4_4_ = auVar4._4_4_ + auVar6._4_4_;
  auVar120._8_4_ = auVar4._8_4_ + auVar6._8_4_;
  auVar120._12_4_ = auVar4._12_4_ + auVar6._12_4_;
  auVar161._8_8_ = 0x3f800000;
  auVar161._0_8_ = 0x3f800000;
  auVar4 = vsubps_avx(auVar161,auVar120);
  auVar6 = vsubps_avx(auVar161,auVar257);
  auVar258._0_4_ = fVar184 * auVar4._0_4_;
  auVar258._4_4_ = fVar196 * auVar4._4_4_;
  auVar258._8_4_ = fVar197 * auVar4._8_4_;
  auVar258._12_4_ = fVar198 * auVar4._12_4_;
  auVar246._0_4_ = fVar184 * auVar6._0_4_;
  auVar246._4_4_ = fVar196 * auVar6._4_4_;
  auVar246._8_4_ = fVar197 * auVar6._8_4_;
  auVar246._12_4_ = fVar198 * auVar6._12_4_;
  auVar121._0_4_ = fVar93 * auVar4._0_4_;
  auVar121._4_4_ = fVar68 * auVar4._4_4_;
  auVar121._8_4_ = fVar150 * auVar4._8_4_;
  auVar121._12_4_ = fVar221 * auVar4._12_4_;
  auVar162._0_4_ = fVar93 * auVar6._0_4_;
  auVar162._4_4_ = fVar68 * auVar6._4_4_;
  auVar162._8_4_ = fVar150 * auVar6._8_4_;
  auVar162._12_4_ = fVar221 * auVar6._12_4_;
  auVar4 = vminps_avx(auVar258,auVar246);
  auVar6 = vminps_avx(auVar121,auVar162);
  auVar4 = vminps_avx(auVar4,auVar6);
  auVar6 = vmaxps_avx(auVar246,auVar258);
  auVar202 = vmaxps_avx(auVar162,auVar121);
  auVar236 = vminps_avx(auVar262,auVar214);
  auVar69 = vminps_avx(auVar104,auVar229);
  auVar236 = vminps_avx(auVar236,auVar69);
  auVar4 = vhaddps_avx(auVar4,auVar236);
  auVar6 = vmaxps_avx(auVar202,auVar6);
  auVar202 = vmaxps_avx(auVar214,auVar262);
  auVar236 = vmaxps_avx(auVar229,auVar104);
  auVar202 = vmaxps_avx(auVar236,auVar202);
  auVar6 = vhaddps_avx(auVar6,auVar202);
  auVar4 = vshufps_avx(auVar4,auVar4,0xe8);
  auVar6 = vshufps_avx(auVar6,auVar6,0xe8);
  auVar230._0_4_ = auVar70._0_4_ + auVar4._0_4_;
  auVar230._4_4_ = auVar70._4_4_ + auVar4._4_4_;
  auVar230._8_4_ = auVar70._8_4_ + auVar4._8_4_;
  auVar230._12_4_ = auVar70._12_4_ + auVar4._12_4_;
  auVar215._0_4_ = auVar70._0_4_ + auVar6._0_4_;
  auVar215._4_4_ = auVar70._4_4_ + auVar6._4_4_;
  auVar215._8_4_ = auVar70._8_4_ + auVar6._8_4_;
  auVar215._12_4_ = auVar70._12_4_ + auVar6._12_4_;
  auVar220 = ZEXT1664(auVar215);
  auVar4 = vmaxps_avx(auVar243,auVar230);
  auVar6 = vminps_avx(auVar215,auVar158);
  auVar4 = vcmpps_avx(auVar6,auVar4,1);
  auVar4 = vshufps_avx(auVar4,auVar4,0x50);
  if ((auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar4[0xf] < '\0')
  goto LAB_0135764e;
  bVar61 = 0;
  if ((auVar195._0_4_ < auVar230._0_4_) && (bVar61 = 0, auVar215._0_4_ < auVar158._0_4_)) {
    auVar6 = vmovshdup_avx(auVar230);
    auVar4 = vcmpps_avx(auVar215,auVar158,1);
    bVar61 = auVar4[4] & auVar72._0_4_ < auVar6._0_4_;
  }
  auVar220 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar63 || fVar67 < 0.001) | bVar61) != 1) goto LAB_01358343;
  lVar60 = 0xc9;
  do {
    lVar60 = lVar60 + -1;
    if (lVar60 == 0) goto LAB_0135764e;
    fVar68 = auVar70._0_4_;
    fVar93 = 1.0 - fVar68;
    fVar67 = fVar93 * fVar93 * fVar93;
    fVar91 = fVar68 * 3.0 * fVar93 * fVar93;
    fVar93 = fVar93 * fVar68 * fVar68 * 3.0;
    auVar145._4_4_ = fVar67;
    auVar145._0_4_ = fVar67;
    auVar145._8_4_ = fVar67;
    auVar145._12_4_ = fVar67;
    auVar122._4_4_ = fVar91;
    auVar122._0_4_ = fVar91;
    auVar122._8_4_ = fVar91;
    auVar122._12_4_ = fVar91;
    auVar105._4_4_ = fVar93;
    auVar105._0_4_ = fVar93;
    auVar105._8_4_ = fVar93;
    auVar105._12_4_ = fVar93;
    fVar68 = fVar68 * fVar68 * fVar68;
    auVar163._0_4_ = (float)local_238._0_4_ * fVar68;
    auVar163._4_4_ = (float)local_238._4_4_ * fVar68;
    auVar163._8_4_ = fStack_230 * fVar68;
    auVar163._12_4_ = fStack_22c * fVar68;
    auVar12 = vfmadd231ps_fma(auVar163,local_4f8,auVar105);
    auVar12 = vfmadd231ps_fma(auVar12,local_4e8,auVar122);
    auVar12 = vfmadd231ps_fma(auVar12,local_4d8,auVar145);
    auVar106._8_8_ = auVar12._0_8_;
    auVar106._0_8_ = auVar12._0_8_;
    auVar12 = vshufpd_avx(auVar12,auVar12,3);
    auVar4 = vshufps_avx(auVar70,auVar70,0x55);
    auVar12 = vsubps_avx(auVar12,auVar106);
    auVar4 = vfmadd213ps_fma(auVar12,auVar4,auVar106);
    fVar67 = auVar4._0_4_;
    auVar12 = vshufps_avx(auVar4,auVar4,0x55);
    auVar107._0_4_ = fVar127 * fVar67 + fVar92 * auVar12._0_4_;
    auVar107._4_4_ = auVar134._4_4_ * fVar67 + auVar5._4_4_ * auVar12._4_4_;
    auVar107._8_4_ = auVar134._8_4_ * fVar67 + auVar5._8_4_ * auVar12._8_4_;
    auVar107._12_4_ = auVar134._12_4_ * fVar67 + auVar5._12_4_ * auVar12._12_4_;
    auVar70 = vsubps_avx(auVar70,auVar107);
    auVar12 = vandps_avx(local_248,auVar4);
    auVar4 = vshufps_avx(auVar12,auVar12,0xf5);
    auVar12 = vmaxss_avx(auVar4,auVar12);
  } while ((float)local_258._0_4_ <= auVar12._0_4_);
  fVar67 = auVar70._0_4_;
  if ((fVar67 < 0.0) || (1.0 < fVar67)) goto LAB_0135764e;
  auVar12 = vmovshdup_avx(auVar70);
  fVar91 = auVar12._0_4_;
  if ((fVar91 < 0.0) || (1.0 < fVar91)) goto LAB_0135764e;
  auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar202 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->super_RayK<1>).org.field_0;
  auVar12 = vsubps_avx(local_448,(undefined1  [16])aVar2);
  auVar12 = vdpps_avx(auVar12,auVar202,0x7f);
  auVar4 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar4 = vdpps_avx(auVar4,auVar202,0x7f);
  auVar134 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar134 = vdpps_avx(auVar134,auVar202,0x7f);
  auVar5 = vsubps_avx(local_468,(undefined1  [16])aVar2);
  auVar5 = vdpps_avx(auVar5,auVar202,0x7f);
  auVar6 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
  auVar6 = vdpps_avx(auVar6,auVar202,0x7f);
  auVar243 = vsubps_avx(_local_498,(undefined1  [16])aVar2);
  auVar243 = vdpps_avx(auVar243,auVar202,0x7f);
  auVar158 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar158 = vdpps_avx(auVar158,auVar202,0x7f);
  auVar53._4_4_ = fStack_4b4;
  auVar53._0_4_ = local_4b8;
  auVar53._8_4_ = fStack_4b0;
  auVar53._12_4_ = fStack_4ac;
  auVar236 = vsubps_avx(auVar53,(undefined1  [16])aVar2);
  auVar202 = vdpps_avx(auVar236,auVar202,0x7f);
  fVar127 = 1.0 - fVar91;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * fVar91)),ZEXT416((uint)fVar127),auVar12);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ * fVar91)),ZEXT416((uint)fVar127),auVar4);
  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar158._0_4_ * fVar91)),ZEXT416((uint)fVar127),
                             auVar134);
  auVar220 = ZEXT1664(auVar134);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar202._0_4_)),ZEXT416((uint)fVar127),auVar5);
  fVar93 = 1.0 - fVar67;
  fVar91 = fVar93 * fVar67 * fVar67 * 3.0;
  fVar150 = fVar67 * fVar67 * fVar67;
  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar150)),ZEXT416((uint)fVar91),auVar134)
  ;
  fVar127 = fVar67 * 3.0 * fVar93 * fVar93;
  auVar4 = vfmadd231ss_fma(auVar134,ZEXT416((uint)fVar127),auVar4);
  fVar92 = fVar93 * fVar93 * fVar93;
  auVar12 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar92),auVar12);
  fVar68 = auVar12._0_4_;
  if (((fVar68 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
      (fVar221 = (ray->super_RayK<1>).tfar, fVar221 < fVar68)) ||
     (pGVar8 = (context->scene->geometries).items[uVar58].ptr,
     (pGVar8->mask & (ray->super_RayK<1>).mask) == 0)) goto LAB_0135764e;
  auVar12 = vshufps_avx(auVar70,auVar70,0x55);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = 0x3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar4 = vsubps_avx(auVar204,auVar12);
  fVar184 = auVar12._0_4_;
  auVar216._0_4_ = fVar184 * (float)local_458._0_4_;
  fVar196 = auVar12._4_4_;
  auVar216._4_4_ = fVar196 * (float)local_458._4_4_;
  fVar197 = auVar12._8_4_;
  auVar216._8_4_ = fVar197 * fStack_450;
  fVar198 = auVar12._12_4_;
  auVar216._12_4_ = fVar198 * fStack_44c;
  auVar231._0_4_ = fVar184 * (float)local_498._0_4_;
  auVar231._4_4_ = fVar196 * (float)local_498._4_4_;
  auVar231._8_4_ = fVar197 * fStack_490;
  auVar231._12_4_ = fVar198 * fStack_48c;
  auVar239._0_4_ = fVar184 * (float)local_4a8._0_4_;
  auVar239._4_4_ = fVar196 * (float)local_4a8._4_4_;
  auVar239._8_4_ = fVar197 * fStack_4a0;
  auVar239._12_4_ = fVar198 * fStack_49c;
  auVar189._0_4_ = fVar184 * local_4b8;
  auVar189._4_4_ = fVar196 * fStack_4b4;
  auVar189._8_4_ = fVar197 * fStack_4b0;
  auVar189._12_4_ = fVar198 * fStack_4ac;
  auVar12 = vfmadd231ps_fma(auVar216,auVar4,local_448);
  auVar134 = vfmadd231ps_fma(auVar231,auVar4,local_478);
  auVar5 = vfmadd231ps_fma(auVar239,auVar4,local_488);
  auVar6 = vfmadd231ps_fma(auVar189,auVar4,local_468);
  auVar12 = vsubps_avx(auVar134,auVar12);
  auVar4 = vsubps_avx(auVar5,auVar134);
  auVar220 = ZEXT1664(auVar4);
  auVar134 = vsubps_avx(auVar6,auVar5);
  auVar240._0_4_ = fVar67 * auVar4._0_4_;
  auVar240._4_4_ = fVar67 * auVar4._4_4_;
  auVar240._8_4_ = fVar67 * auVar4._8_4_;
  auVar240._12_4_ = fVar67 * auVar4._12_4_;
  auVar182._4_4_ = fVar93;
  auVar182._0_4_ = fVar93;
  auVar182._8_4_ = fVar93;
  auVar182._12_4_ = fVar93;
  auVar12 = vfmadd231ps_fma(auVar240,auVar182,auVar12);
  auVar190._0_4_ = fVar67 * auVar134._0_4_;
  auVar190._4_4_ = fVar67 * auVar134._4_4_;
  auVar190._8_4_ = fVar67 * auVar134._8_4_;
  auVar190._12_4_ = fVar67 * auVar134._12_4_;
  auVar134 = vfmadd231ps_fma(auVar190,auVar182,auVar4);
  auVar191._0_4_ = fVar67 * auVar134._0_4_;
  auVar191._4_4_ = fVar67 * auVar134._4_4_;
  auVar191._8_4_ = fVar67 * auVar134._8_4_;
  auVar191._12_4_ = fVar67 * auVar134._12_4_;
  auVar134 = vfmadd231ps_fma(auVar191,auVar182,auVar12);
  auVar164._0_4_ = fVar150 * (float)local_2a8._0_4_;
  auVar164._4_4_ = fVar150 * (float)local_2a8._4_4_;
  auVar164._8_4_ = fVar150 * fStack_2a0;
  auVar164._12_4_ = fVar150 * fStack_29c;
  auVar123._4_4_ = fVar91;
  auVar123._0_4_ = fVar91;
  auVar123._8_4_ = fVar91;
  auVar123._12_4_ = fVar91;
  auVar12 = vfmadd132ps_fma(auVar123,auVar164,local_298);
  auVar146._4_4_ = fVar127;
  auVar146._0_4_ = fVar127;
  auVar146._8_4_ = fVar127;
  auVar146._12_4_ = fVar127;
  auVar12 = vfmadd132ps_fma(auVar146,auVar12,local_288);
  auVar165._0_4_ = auVar134._0_4_ * 3.0;
  auVar165._4_4_ = auVar134._4_4_ * 3.0;
  auVar165._8_4_ = auVar134._8_4_ * 3.0;
  auVar165._12_4_ = auVar134._12_4_ * 3.0;
  auVar137._4_4_ = fVar92;
  auVar137._0_4_ = fVar92;
  auVar137._8_4_ = fVar92;
  auVar137._12_4_ = fVar92;
  auVar134 = vfmadd132ps_fma(auVar137,auVar12,local_278);
  auVar12 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar124._0_4_ = auVar134._0_4_ * auVar12._0_4_;
  auVar124._4_4_ = auVar134._4_4_ * auVar12._4_4_;
  auVar124._8_4_ = auVar134._8_4_ * auVar12._8_4_;
  auVar124._12_4_ = auVar134._12_4_ * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar134,auVar134,0xc9);
  auVar134 = vfmsub231ps_fma(auVar124,auVar165,auVar12);
  auVar12 = vshufps_avx(auVar134,auVar134,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar68;
    uVar94 = vmovlps_avx(auVar12);
    *(undefined8 *)&(ray->Ng).field_0 = uVar94;
    (ray->Ng).field_0.field_0.z = auVar134._0_4_;
    uVar94 = vmovlps_avx(auVar70);
    ray->u = (float)(int)uVar94;
    ray->v = (float)(int)((ulong)uVar94 >> 0x20);
    ray->primID = (uint)local_4c0;
    ray->geomID = uVar58;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_0135764e;
  }
  local_2f8 = vmovlps_avx(auVar12);
  local_2f0 = auVar134._0_4_;
  local_2ec = vmovlps_avx(auVar70);
  local_2e4 = (uint)local_4c0;
  local_2e0 = uVar58;
  local_2dc = context->user->instID[0];
  local_2d8 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar68;
  local_4fc = -1;
  local_398.valid = &local_4fc;
  local_398.geometryUserPtr = pGVar8->userPtr;
  local_398.context = context->user;
  local_398.ray = (RTCRayN *)ray;
  local_398.hit = (RTCHitN *)&local_2f8;
  local_398.N = 1;
  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    auVar220 = ZEXT1664(auVar4);
    (*pGVar8->intersectionFilterN)(&local_398);
    if (*local_398.valid == 0) goto LAB_013584cb;
  }
  p_Var9 = context->args->filter;
  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
    auVar220 = ZEXT1664(auVar220._0_16_);
    (*p_Var9)(&local_398);
    if (*local_398.valid == 0) {
LAB_013584cb:
      (ray->super_RayK<1>).tfar = fVar221;
      goto LAB_0135764e;
    }
  }
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).components[0] = *(float *)local_398.hit;
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).field_0.y = *(float *)(local_398.hit + 4);
  (((Vec3f *)((long)local_398.ray + 0x30))->field_0).field_0.z = *(float *)(local_398.hit + 8);
  *(float *)((long)local_398.ray + 0x3c) = *(float *)(local_398.hit + 0xc);
  *(float *)((long)local_398.ray + 0x40) = *(float *)(local_398.hit + 0x10);
  *(float *)((long)local_398.ray + 0x44) = *(float *)(local_398.hit + 0x14);
  *(float *)((long)local_398.ray + 0x48) = *(float *)(local_398.hit + 0x18);
  *(float *)((long)local_398.ray + 0x4c) = *(float *)(local_398.hit + 0x1c);
  *(float *)((long)local_398.ray + 0x50) = *(float *)(local_398.hit + 0x20);
  goto LAB_0135764e;
LAB_01358343:
  local_268 = vinsertps_avx(auVar12,ZEXT416((uint)fVar91),0x10);
  auVar76 = vinsertps_avx(auVar72,ZEXT416((uint)auVar71._0_4_),0x10);
  goto LAB_013570a3;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }